

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  uint uVar51;
  AABBNodeMB4D *node1;
  ulong uVar52;
  ushort uVar53;
  undefined4 uVar54;
  undefined1 (*pauVar55) [64];
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  NodeRef root;
  ulong *puVar61;
  bool bVar62;
  ulong uVar63;
  ulong uVar64;
  int iVar65;
  undefined1 auVar66 [16];
  int iVar92;
  int iVar93;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  int iVar94;
  int iVar106;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar107 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM23 [64];
  Precalculations pre;
  vuint<4> *v;
  vint<16> itime;
  Vec3<embree::vfloat_impl<16>_> p1;
  Vec3<embree::vfloat_impl<16>_> p0;
  TravRayK<16,_false> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a8f4;
  uint local_a8f0;
  Precalculations local_a8d9;
  BVH *local_a8d8;
  ulong local_a8d0;
  RayQueryContext *local_a8c8;
  ulong local_a8c0;
  ulong local_a8b8;
  uint local_a8ac;
  ulong local_a8a8;
  Intersectors *local_a8a0;
  RayK<16> *local_a898;
  ulong local_a890;
  ulong local_a888;
  undefined1 local_a880 [64];
  undefined1 local_a840 [16];
  RTCRayQueryContext *pRStack_a830;
  RayK<16> *pRStack_a828;
  undefined8 *puStack_a820;
  undefined4 uStack_a818;
  undefined1 auStack_a814 [20];
  undefined8 local_a800;
  int iStack_a7f8;
  int iStack_a7f4;
  int iStack_a7f0;
  int iStack_a7ec;
  int iStack_a7e8;
  int iStack_a7e4;
  int iStack_a7e0;
  int iStack_a7dc;
  int iStack_a7d8;
  int iStack_a7d4;
  int iStack_a7d0;
  int iStack_a7cc;
  int iStack_a7c8;
  int iStack_a7c4;
  undefined8 local_a7a0;
  undefined8 uStack_a798;
  undefined8 local_a790;
  undefined8 uStack_a788;
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  undefined1 local_a700 [64];
  undefined8 local_a6c0;
  undefined8 uStack_a6b8;
  undefined8 uStack_a6b0;
  undefined8 uStack_a6a8;
  undefined8 uStack_a6a0;
  undefined8 uStack_a698;
  undefined8 uStack_a690;
  undefined8 uStack_a688;
  undefined8 local_a680;
  undefined8 uStack_a678;
  undefined8 uStack_a670;
  undefined8 uStack_a668;
  undefined8 uStack_a660;
  undefined8 uStack_a658;
  undefined8 uStack_a650;
  undefined8 uStack_a648;
  undefined8 local_a640;
  undefined8 uStack_a638;
  undefined8 uStack_a630;
  undefined8 uStack_a628;
  undefined8 uStack_a620;
  undefined8 uStack_a618;
  undefined8 uStack_a610;
  undefined8 uStack_a608;
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  undefined1 local_a380 [64];
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a2c0;
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  undefined1 local_a0c0 [64];
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  undefined1 local_9fc0 [64];
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  uint local_9f00;
  uint uStack_9efc;
  uint uStack_9ef8;
  uint uStack_9ef4;
  uint uStack_9ef0;
  uint uStack_9eec;
  uint uStack_9ee8;
  uint uStack_9ee4;
  uint uStack_9ee0;
  uint uStack_9edc;
  uint uStack_9ed8;
  uint uStack_9ed4;
  uint uStack_9ed0;
  uint uStack_9ecc;
  uint uStack_9ec8;
  uint uStack_9ec4;
  uint local_9ec0;
  uint uStack_9ebc;
  uint uStack_9eb8;
  uint uStack_9eb4;
  uint uStack_9eb0;
  uint uStack_9eac;
  uint uStack_9ea8;
  uint uStack_9ea4;
  uint uStack_9ea0;
  uint uStack_9e9c;
  uint uStack_9e98;
  uint uStack_9e94;
  uint uStack_9e90;
  uint uStack_9e8c;
  uint uStack_9e88;
  uint uStack_9e84;
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a8d8 = (BVH *)This->ptr;
  if ((local_a8d8->root).ptr != 8) {
    auVar67 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar107 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar63 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar107,5);
    uVar58 = vpcmpeqd_avx512f(auVar67,(undefined1  [64])valid_i->field_0);
    uVar63 = uVar63 & uVar58;
    if ((ushort)uVar63 != 0) {
      local_a2c0.field_0.x.field_0 =
           (vfloat_impl<16>)(vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray;
      local_a2c0.field_0.y.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40);
      local_a2c0.field_0.z.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80);
      local_a200 = *(undefined1 (*) [64])(ray + 0x100);
      local_a1c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_a180 = *(undefined1 (*) [64])(ray + 0x180);
      auVar68 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar67 = vandps_avx512dq(local_a200,auVar68);
      auVar69 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar58 = vcmpps_avx512f(auVar67,auVar69,1);
      bVar62 = (bool)((byte)uVar58 & 1);
      iVar65 = auVar69._0_4_;
      auVar67._0_4_ = (uint)bVar62 * iVar65 | (uint)!bVar62 * local_a200._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      iVar92 = auVar69._4_4_;
      auVar67._4_4_ = (uint)bVar62 * iVar92 | (uint)!bVar62 * local_a200._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      iVar93 = auVar69._8_4_;
      auVar67._8_4_ = (uint)bVar62 * iVar93 | (uint)!bVar62 * local_a200._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      iVar94 = auVar69._12_4_;
      auVar67._12_4_ = (uint)bVar62 * iVar94 | (uint)!bVar62 * local_a200._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      iVar95 = auVar69._16_4_;
      auVar67._16_4_ = (uint)bVar62 * iVar95 | (uint)!bVar62 * local_a200._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      iVar96 = auVar69._20_4_;
      auVar67._20_4_ = (uint)bVar62 * iVar96 | (uint)!bVar62 * local_a200._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      iVar97 = auVar69._24_4_;
      auVar67._24_4_ = (uint)bVar62 * iVar97 | (uint)!bVar62 * local_a200._24_4_;
      bVar62 = (bool)((byte)(uVar58 >> 7) & 1);
      iVar98 = auVar69._28_4_;
      auVar67._28_4_ = (uint)bVar62 * iVar98 | (uint)!bVar62 * local_a200._28_4_;
      bVar62 = (bool)((byte)(uVar58 >> 8) & 1);
      iVar99 = auVar69._32_4_;
      auVar67._32_4_ = (uint)bVar62 * iVar99 | (uint)!bVar62 * local_a200._32_4_;
      bVar62 = (bool)((byte)(uVar58 >> 9) & 1);
      iVar100 = auVar69._36_4_;
      auVar67._36_4_ = (uint)bVar62 * iVar100 | (uint)!bVar62 * local_a200._36_4_;
      bVar62 = (bool)((byte)(uVar58 >> 10) & 1);
      iVar101 = auVar69._40_4_;
      auVar67._40_4_ = (uint)bVar62 * iVar101 | (uint)!bVar62 * local_a200._40_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xb) & 1);
      iVar102 = auVar69._44_4_;
      auVar67._44_4_ = (uint)bVar62 * iVar102 | (uint)!bVar62 * local_a200._44_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xc) & 1);
      iVar103 = auVar69._48_4_;
      auVar67._48_4_ = (uint)bVar62 * iVar103 | (uint)!bVar62 * local_a200._48_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xd) & 1);
      iVar104 = auVar69._52_4_;
      auVar67._52_4_ = (uint)bVar62 * iVar104 | (uint)!bVar62 * local_a200._52_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xe) & 1);
      iVar105 = auVar69._56_4_;
      iVar106 = auVar69._60_4_;
      auVar67._56_4_ = (uint)bVar62 * iVar105 | (uint)!bVar62 * local_a200._56_4_;
      bVar62 = SUB81(uVar58 >> 0xf,0);
      auVar67._60_4_ = (uint)bVar62 * iVar106 | (uint)!bVar62 * local_a200._60_4_;
      auVar70 = vandps_avx512dq(local_a1c0,auVar68);
      uVar58 = vcmpps_avx512f(auVar70,auVar69,1);
      bVar62 = (bool)((byte)uVar58 & 1);
      auVar70._0_4_ = (uint)bVar62 * iVar65 | (uint)!bVar62 * local_a1c0._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar62 * iVar92 | (uint)!bVar62 * local_a1c0._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar62 * iVar93 | (uint)!bVar62 * local_a1c0._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar62 * iVar94 | (uint)!bVar62 * local_a1c0._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar70._16_4_ = (uint)bVar62 * iVar95 | (uint)!bVar62 * local_a1c0._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar70._20_4_ = (uint)bVar62 * iVar96 | (uint)!bVar62 * local_a1c0._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar70._24_4_ = (uint)bVar62 * iVar97 | (uint)!bVar62 * local_a1c0._24_4_;
      bVar62 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar70._28_4_ = (uint)bVar62 * iVar98 | (uint)!bVar62 * local_a1c0._28_4_;
      bVar62 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar70._32_4_ = (uint)bVar62 * iVar99 | (uint)!bVar62 * local_a1c0._32_4_;
      bVar62 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar70._36_4_ = (uint)bVar62 * iVar100 | (uint)!bVar62 * local_a1c0._36_4_;
      bVar62 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar70._40_4_ = (uint)bVar62 * iVar101 | (uint)!bVar62 * local_a1c0._40_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar70._44_4_ = (uint)bVar62 * iVar102 | (uint)!bVar62 * local_a1c0._44_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar70._48_4_ = (uint)bVar62 * iVar103 | (uint)!bVar62 * local_a1c0._48_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar70._52_4_ = (uint)bVar62 * iVar104 | (uint)!bVar62 * local_a1c0._52_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar70._56_4_ = (uint)bVar62 * iVar105 | (uint)!bVar62 * local_a1c0._56_4_;
      bVar62 = SUB81(uVar58 >> 0xf,0);
      auVar70._60_4_ = (uint)bVar62 * iVar106 | (uint)!bVar62 * local_a1c0._60_4_;
      auVar71 = vandps_avx512dq(local_a180,auVar68);
      uVar58 = vcmpps_avx512f(auVar71,auVar69,1);
      auVar69 = vrcp14ps_avx512f(auVar67);
      bVar62 = (bool)((byte)uVar58 & 1);
      auVar71._0_4_ = (uint)bVar62 * iVar65 | (uint)!bVar62 * local_a180._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar71._4_4_ = (uint)bVar62 * iVar92 | (uint)!bVar62 * local_a180._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar71._8_4_ = (uint)bVar62 * iVar93 | (uint)!bVar62 * local_a180._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar71._12_4_ = (uint)bVar62 * iVar94 | (uint)!bVar62 * local_a180._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar71._16_4_ = (uint)bVar62 * iVar95 | (uint)!bVar62 * local_a180._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar71._20_4_ = (uint)bVar62 * iVar96 | (uint)!bVar62 * local_a180._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar71._24_4_ = (uint)bVar62 * iVar97 | (uint)!bVar62 * local_a180._24_4_;
      bVar62 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar71._28_4_ = (uint)bVar62 * iVar98 | (uint)!bVar62 * local_a180._28_4_;
      bVar62 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar71._32_4_ = (uint)bVar62 * iVar99 | (uint)!bVar62 * local_a180._32_4_;
      bVar62 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar71._36_4_ = (uint)bVar62 * iVar100 | (uint)!bVar62 * local_a180._36_4_;
      bVar62 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar71._40_4_ = (uint)bVar62 * iVar101 | (uint)!bVar62 * local_a180._40_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar71._44_4_ = (uint)bVar62 * iVar102 | (uint)!bVar62 * local_a180._44_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar71._48_4_ = (uint)bVar62 * iVar103 | (uint)!bVar62 * local_a180._48_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar71._52_4_ = (uint)bVar62 * iVar104 | (uint)!bVar62 * local_a180._52_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar71._56_4_ = (uint)bVar62 * iVar105 | (uint)!bVar62 * local_a180._56_4_;
      bVar62 = SUB81(uVar58 >> 0xf,0);
      auVar71._60_4_ = (uint)bVar62 * iVar106 | (uint)!bVar62 * local_a180._60_4_;
      auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar73 = vrcp14ps_avx512f(auVar70);
      auVar67 = vfnmadd213ps_avx512f(auVar67,auVar69,auVar72);
      local_a140 = vfmadd132ps_avx512f(auVar67,auVar69,auVar69);
      auVar67 = vfnmadd213ps_avx512f(auVar70,auVar73,auVar72);
      auVar69 = vrcp14ps_avx512f(auVar71);
      local_a100 = vfmadd132ps_avx512f(auVar67,auVar73,auVar73);
      auVar67 = vfnmadd213ps_avx512f(auVar71,auVar69,auVar72);
      local_a0c0 = vfmadd132ps_avx512f(auVar67,auVar69,auVar69);
      local_a080 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray,local_a140)
      ;
      local_a040 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40),
                                  local_a100);
      local_a000 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80),
                                  local_a0c0);
      uVar58 = vcmpps_avx512f(local_a140,auVar107,1);
      auVar67 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar69._4_4_ = (uint)((byte)(uVar58 >> 1) & 1) * auVar67._4_4_;
      auVar69._0_4_ = (uint)((byte)uVar58 & 1) * auVar67._0_4_;
      auVar69._8_4_ = (uint)((byte)(uVar58 >> 2) & 1) * auVar67._8_4_;
      auVar69._12_4_ = (uint)((byte)(uVar58 >> 3) & 1) * auVar67._12_4_;
      auVar69._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * auVar67._16_4_;
      auVar69._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * auVar67._20_4_;
      auVar69._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * auVar67._24_4_;
      auVar69._28_4_ = (uint)((byte)(uVar58 >> 7) & 1) * auVar67._28_4_;
      auVar69._32_4_ = (uint)((byte)(uVar58 >> 8) & 1) * auVar67._32_4_;
      auVar69._36_4_ = (uint)((byte)(uVar58 >> 9) & 1) * auVar67._36_4_;
      auVar69._40_4_ = (uint)((byte)(uVar58 >> 10) & 1) * auVar67._40_4_;
      auVar69._44_4_ = (uint)((byte)(uVar58 >> 0xb) & 1) * auVar67._44_4_;
      auVar69._48_4_ = (uint)((byte)(uVar58 >> 0xc) & 1) * auVar67._48_4_;
      auVar69._52_4_ = (uint)((byte)(uVar58 >> 0xd) & 1) * auVar67._52_4_;
      auVar69._56_4_ = (uint)((byte)(uVar58 >> 0xe) & 1) * auVar67._56_4_;
      auVar69._60_4_ = (uint)(byte)(uVar58 >> 0xf) * auVar67._60_4_;
      local_9fc0 = vmovdqa64_avx512f(auVar69);
      uVar58 = vcmpps_avx512f(local_a100,auVar107,5);
      auVar67 = vpbroadcastd_avx512f(ZEXT416(0x60));
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar62 = (bool)((byte)uVar58 & 1);
      auVar73._0_4_ = (uint)bVar62 * auVar69._0_4_ | (uint)!bVar62 * auVar67._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar62 * auVar69._4_4_ | (uint)!bVar62 * auVar67._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar62 * auVar69._8_4_ | (uint)!bVar62 * auVar67._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar62 * auVar69._12_4_ | (uint)!bVar62 * auVar67._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar73._16_4_ = (uint)bVar62 * auVar69._16_4_ | (uint)!bVar62 * auVar67._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar73._20_4_ = (uint)bVar62 * auVar69._20_4_ | (uint)!bVar62 * auVar67._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar73._24_4_ = (uint)bVar62 * auVar69._24_4_ | (uint)!bVar62 * auVar67._24_4_;
      bVar62 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar73._28_4_ = (uint)bVar62 * auVar69._28_4_ | (uint)!bVar62 * auVar67._28_4_;
      bVar62 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar73._32_4_ = (uint)bVar62 * auVar69._32_4_ | (uint)!bVar62 * auVar67._32_4_;
      bVar62 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar73._36_4_ = (uint)bVar62 * auVar69._36_4_ | (uint)!bVar62 * auVar67._36_4_;
      bVar62 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar73._40_4_ = (uint)bVar62 * auVar69._40_4_ | (uint)!bVar62 * auVar67._40_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar73._44_4_ = (uint)bVar62 * auVar69._44_4_ | (uint)!bVar62 * auVar67._44_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar73._48_4_ = (uint)bVar62 * auVar69._48_4_ | (uint)!bVar62 * auVar67._48_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar73._52_4_ = (uint)bVar62 * auVar69._52_4_ | (uint)!bVar62 * auVar67._52_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar73._56_4_ = (uint)bVar62 * auVar69._56_4_ | (uint)!bVar62 * auVar67._56_4_;
      bVar62 = SUB81(uVar58 >> 0xf,0);
      auVar73._60_4_ = (uint)bVar62 * auVar69._60_4_ | (uint)!bVar62 * auVar67._60_4_;
      local_9f80 = vmovdqa64_avx512f(auVar73);
      uVar58 = vcmpps_avx512f(local_a0c0,auVar107,5);
      auVar67 = vpbroadcastd_avx512f(ZEXT416(0xa0));
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x80));
      bVar62 = (bool)((byte)uVar58 & 1);
      auVar83._0_4_ = (uint)bVar62 * auVar69._0_4_ | (uint)!bVar62 * auVar67._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar83._4_4_ = (uint)bVar62 * auVar69._4_4_ | (uint)!bVar62 * auVar67._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar83._8_4_ = (uint)bVar62 * auVar69._8_4_ | (uint)!bVar62 * auVar67._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar83._12_4_ = (uint)bVar62 * auVar69._12_4_ | (uint)!bVar62 * auVar67._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar83._16_4_ = (uint)bVar62 * auVar69._16_4_ | (uint)!bVar62 * auVar67._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar83._20_4_ = (uint)bVar62 * auVar69._20_4_ | (uint)!bVar62 * auVar67._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar83._24_4_ = (uint)bVar62 * auVar69._24_4_ | (uint)!bVar62 * auVar67._24_4_;
      bVar62 = (bool)((byte)(uVar58 >> 7) & 1);
      auVar83._28_4_ = (uint)bVar62 * auVar69._28_4_ | (uint)!bVar62 * auVar67._28_4_;
      bVar62 = (bool)((byte)(uVar58 >> 8) & 1);
      auVar83._32_4_ = (uint)bVar62 * auVar69._32_4_ | (uint)!bVar62 * auVar67._32_4_;
      bVar62 = (bool)((byte)(uVar58 >> 9) & 1);
      auVar83._36_4_ = (uint)bVar62 * auVar69._36_4_ | (uint)!bVar62 * auVar67._36_4_;
      bVar62 = (bool)((byte)(uVar58 >> 10) & 1);
      auVar83._40_4_ = (uint)bVar62 * auVar69._40_4_ | (uint)!bVar62 * auVar67._40_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xb) & 1);
      auVar83._44_4_ = (uint)bVar62 * auVar69._44_4_ | (uint)!bVar62 * auVar67._44_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xc) & 1);
      auVar83._48_4_ = (uint)bVar62 * auVar69._48_4_ | (uint)!bVar62 * auVar67._48_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xd) & 1);
      auVar83._52_4_ = (uint)bVar62 * auVar69._52_4_ | (uint)!bVar62 * auVar67._52_4_;
      bVar62 = (bool)((byte)(uVar58 >> 0xe) & 1);
      auVar83._56_4_ = (uint)bVar62 * auVar69._56_4_ | (uint)!bVar62 * auVar67._56_4_;
      bVar62 = SUB81(uVar58 >> 0xf,0);
      auVar83._60_4_ = (uint)bVar62 * auVar69._60_4_ | (uint)!bVar62 * auVar67._60_4_;
      local_9f40 = vmovdqa64_avx512f(auVar83);
      auVar69 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      local_a8ac = (uint)uVar63;
      auVar67 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar107);
      bVar62 = (bool)((byte)uVar63 & 1);
      local_9f00 = (uint)bVar62 * auVar67._0_4_ | (uint)!bVar62 * auVar69._0_4_;
      bVar62 = (bool)((byte)(uVar63 >> 1) & 1);
      uStack_9efc = (uint)bVar62 * auVar67._4_4_ | (uint)!bVar62 * auVar69._4_4_;
      bVar62 = (bool)((byte)(uVar63 >> 2) & 1);
      uStack_9ef8 = (uint)bVar62 * auVar67._8_4_ | (uint)!bVar62 * auVar69._8_4_;
      bVar62 = (bool)((byte)(uVar63 >> 3) & 1);
      uStack_9ef4 = (uint)bVar62 * auVar67._12_4_ | (uint)!bVar62 * auVar69._12_4_;
      bVar62 = (bool)((byte)(uVar63 >> 4) & 1);
      uStack_9ef0 = (uint)bVar62 * auVar67._16_4_ | (uint)!bVar62 * auVar69._16_4_;
      bVar62 = (bool)((byte)(uVar63 >> 5) & 1);
      uStack_9eec = (uint)bVar62 * auVar67._20_4_ | (uint)!bVar62 * auVar69._20_4_;
      bVar62 = (bool)((byte)(uVar63 >> 6) & 1);
      uStack_9ee8 = (uint)bVar62 * auVar67._24_4_ | (uint)!bVar62 * auVar69._24_4_;
      bVar62 = (bool)((byte)(uVar63 >> 7) & 1);
      uStack_9ee4 = (uint)bVar62 * auVar67._28_4_ | (uint)!bVar62 * auVar69._28_4_;
      bVar13 = (byte)(uVar63 >> 8);
      bVar62 = (bool)(bVar13 & 1);
      uStack_9ee0 = (uint)bVar62 * auVar67._32_4_ | (uint)!bVar62 * auVar69._32_4_;
      bVar62 = (bool)((byte)(uVar63 >> 9) & 1);
      uStack_9edc = (uint)bVar62 * auVar67._36_4_ | (uint)!bVar62 * auVar69._36_4_;
      bVar62 = (bool)((byte)(uVar63 >> 10) & 1);
      uStack_9ed8 = (uint)bVar62 * auVar67._40_4_ | (uint)!bVar62 * auVar69._40_4_;
      bVar62 = (bool)((byte)(uVar63 >> 0xb) & 1);
      uStack_9ed4 = (uint)bVar62 * auVar67._44_4_ | (uint)!bVar62 * auVar69._44_4_;
      bVar62 = (bool)((byte)(uVar63 >> 0xc) & 1);
      uStack_9ed0 = (uint)bVar62 * auVar67._48_4_ | (uint)!bVar62 * auVar69._48_4_;
      bVar62 = (bool)((byte)(uVar63 >> 0xd) & 1);
      uStack_9ecc = (uint)bVar62 * auVar67._52_4_ | (uint)!bVar62 * auVar69._52_4_;
      bVar62 = (bool)((byte)(uVar63 >> 0xe) & 1);
      uStack_9ec8 = (uint)bVar62 * auVar67._56_4_ | (uint)!bVar62 * auVar69._56_4_;
      bVar62 = SUB81(uVar63 >> 0xf,0);
      uStack_9ec4 = (uint)bVar62 * auVar67._60_4_ | (uint)!bVar62 * auVar69._60_4_;
      auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar67 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar107);
      bVar62 = (bool)((byte)uVar63 & 1);
      bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar63 >> 7) & 1);
      bVar14 = (bool)(bVar13 & 1);
      bVar15 = (bool)((byte)(uVar63 >> 9) & 1);
      bVar16 = (bool)((byte)(uVar63 >> 10) & 1);
      bVar17 = (bool)((byte)(uVar63 >> 0xb) & 1);
      bVar18 = (bool)((byte)(uVar63 >> 0xc) & 1);
      bVar19 = (bool)((byte)(uVar63 >> 0xd) & 1);
      bVar20 = (bool)((byte)(uVar63 >> 0xe) & 1);
      bVar21 = SUB81(uVar63 >> 0xf,0);
      local_9ec0 = (uint)bVar62 * auVar67._0_4_ | (uint)!bVar62 * auVar70._0_4_;
      uStack_9ebc = (uint)bVar6 * auVar67._4_4_ | (uint)!bVar6 * auVar70._4_4_;
      uStack_9eb8 = (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * auVar70._8_4_;
      uStack_9eb4 = (uint)bVar8 * auVar67._12_4_ | (uint)!bVar8 * auVar70._12_4_;
      uStack_9eb0 = (uint)bVar9 * auVar67._16_4_ | (uint)!bVar9 * auVar70._16_4_;
      uStack_9eac = (uint)bVar10 * auVar67._20_4_ | (uint)!bVar10 * auVar70._20_4_;
      uStack_9ea8 = (uint)bVar11 * auVar67._24_4_ | (uint)!bVar11 * auVar70._24_4_;
      uStack_9ea4 = (uint)bVar12 * auVar67._28_4_ | (uint)!bVar12 * auVar70._28_4_;
      uStack_9ea0 = (uint)bVar14 * auVar67._32_4_ | (uint)!bVar14 * auVar70._32_4_;
      uStack_9e9c = (uint)bVar15 * auVar67._36_4_ | (uint)!bVar15 * auVar70._36_4_;
      uStack_9e98 = (uint)bVar16 * auVar67._40_4_ | (uint)!bVar16 * auVar70._40_4_;
      uStack_9e94 = (uint)bVar17 * auVar67._44_4_ | (uint)!bVar17 * auVar70._44_4_;
      uStack_9e90 = (uint)bVar18 * auVar67._48_4_ | (uint)!bVar18 * auVar70._48_4_;
      uStack_9e8c = (uint)bVar19 * auVar67._52_4_ | (uint)!bVar19 * auVar70._52_4_;
      uStack_9e88 = (uint)bVar20 * auVar67._56_4_ | (uint)!bVar20 * auVar70._56_4_;
      uStack_9e84 = (uint)bVar21 * auVar67._60_4_ | (uint)!bVar21 * auVar70._60_4_;
      local_a8f4 = (uint)(ushort)~(ushort)uVar63;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar59 = 0xe;
      }
      else {
        uVar59 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar59 = 0xe;
        }
      }
      local_a898 = ray + 0x200;
      puVar61 = local_9e40;
      local_9e50 = 0xfffffffffffffff8;
      pauVar55 = (undefined1 (*) [64])local_8c40;
      local_9e48 = (local_a8d8->root).ptr;
      local_8c80 = local_9f00;
      uStack_8c7c = uStack_9efc;
      uStack_8c78 = uStack_9ef8;
      uStack_8c74 = uStack_9ef4;
      uStack_8c70 = uStack_9ef0;
      uStack_8c6c = uStack_9eec;
      uStack_8c68 = uStack_9ee8;
      uStack_8c64 = uStack_9ee4;
      uStack_8c60 = uStack_9ee0;
      uStack_8c5c = uStack_9edc;
      uStack_8c58 = uStack_9ed8;
      uStack_8c54 = uStack_9ed4;
      uStack_8c50 = uStack_9ed0;
      uStack_8c4c = uStack_9ecc;
      uStack_8c48 = uStack_9ec8;
      uStack_8c44 = uStack_9ec4;
      auVar66 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar107 = ZEXT1664(auVar66);
      auVar67 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
      local_a8c8 = context;
      local_a8a0 = This;
      local_8cc0 = auVar69;
      do {
        pauVar55 = pauVar55 + -1;
        root.ptr = puVar61[-1];
        puVar61 = puVar61 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_008daec8:
          iVar65 = 3;
        }
        else {
          auVar71 = *pauVar55;
          auVar74._4_4_ = uStack_9ebc;
          auVar74._0_4_ = local_9ec0;
          auVar74._8_4_ = uStack_9eb8;
          auVar74._12_4_ = uStack_9eb4;
          auVar74._16_4_ = uStack_9eb0;
          auVar74._20_4_ = uStack_9eac;
          auVar74._24_4_ = uStack_9ea8;
          auVar74._28_4_ = uStack_9ea4;
          auVar74._32_4_ = uStack_9ea0;
          auVar74._36_4_ = uStack_9e9c;
          auVar74._40_4_ = uStack_9e98;
          auVar74._44_4_ = uStack_9e94;
          auVar74._48_4_ = uStack_9e90;
          auVar74._52_4_ = uStack_9e8c;
          auVar74._56_4_ = uStack_9e88;
          auVar74._60_4_ = uStack_9e84;
          uVar63 = vcmpps_avx512f(auVar71,auVar74,1);
          if ((short)uVar63 == 0) {
LAB_008daed9:
            iVar65 = 2;
          }
          else {
            uVar54 = (undefined4)uVar63;
            iVar65 = 0;
            if ((uint)POPCOUNT(uVar54) <= uVar59) {
              do {
                local_a880 = auVar71;
                local_a800 = (Ref<embree::Geometry> *)0x0;
                for (uVar58 = uVar63; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000)
                {
                  local_a800 = (Ref<embree::Geometry> *)((long)local_a800 + 1);
                }
                local_a8d0 = uVar63;
                bVar62 = occluded1(local_a8a0,local_a8d8,root,(size_t)local_a800,&local_a8d9,ray,
                                   (TravRayK<16,_false> *)&local_a2c0.field_0,local_a8c8);
                uVar60 = 1 << ((uint)local_a800 & 0x1f);
                if (!bVar62) {
                  uVar60 = 0;
                }
                local_a8f4 = local_a8f4 | uVar60;
                uVar63 = local_a8d0 - 1 & local_a8d0;
                auVar71 = local_a880;
              } while (uVar63 != 0);
              if ((short)local_a8f4 == -1) {
                iVar65 = 3;
              }
              else {
                auVar67 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar62 = (bool)((byte)local_a8f4 & 1);
                bVar6 = (bool)((byte)(local_a8f4 >> 1) & 1);
                bVar7 = (bool)((byte)(local_a8f4 >> 2) & 1);
                bVar8 = (bool)((byte)(local_a8f4 >> 3) & 1);
                bVar9 = (bool)((byte)(local_a8f4 >> 4) & 1);
                bVar10 = (bool)((byte)(local_a8f4 >> 5) & 1);
                bVar11 = (bool)((byte)(local_a8f4 >> 6) & 1);
                bVar12 = (bool)((byte)(local_a8f4 >> 7) & 1);
                bVar14 = (bool)((byte)(local_a8f4 >> 8) & 1);
                bVar15 = (bool)((byte)(local_a8f4 >> 9) & 1);
                bVar16 = (bool)((byte)(local_a8f4 >> 10) & 1);
                bVar17 = (bool)((byte)(local_a8f4 >> 0xb) & 1);
                bVar18 = (bool)((byte)(local_a8f4 >> 0xc) & 1);
                bVar19 = (bool)((byte)(local_a8f4 >> 0xd) & 1);
                bVar20 = (bool)((byte)(local_a8f4 >> 0xe) & 1);
                bVar21 = (bool)((byte)(local_a8f4 >> 0xf) & 1);
                local_9ec0 = (uint)bVar62 * auVar67._0_4_ | !bVar62 * local_9ec0;
                uStack_9ebc = (uint)bVar6 * auVar67._4_4_ | !bVar6 * uStack_9ebc;
                uStack_9eb8 = (uint)bVar7 * auVar67._8_4_ | !bVar7 * uStack_9eb8;
                uStack_9eb4 = (uint)bVar8 * auVar67._12_4_ | !bVar8 * uStack_9eb4;
                uStack_9eb0 = (uint)bVar9 * auVar67._16_4_ | !bVar9 * uStack_9eb0;
                uStack_9eac = (uint)bVar10 * auVar67._20_4_ | !bVar10 * uStack_9eac;
                uStack_9ea8 = (uint)bVar11 * auVar67._24_4_ | !bVar11 * uStack_9ea8;
                uStack_9ea4 = (uint)bVar12 * auVar67._28_4_ | !bVar12 * uStack_9ea4;
                uStack_9ea0 = (uint)bVar14 * auVar67._32_4_ | !bVar14 * uStack_9ea0;
                uStack_9e9c = (uint)bVar15 * auVar67._36_4_ | !bVar15 * uStack_9e9c;
                uStack_9e98 = (uint)bVar16 * auVar67._40_4_ | !bVar16 * uStack_9e98;
                uStack_9e94 = (uint)bVar17 * auVar67._44_4_ | !bVar17 * uStack_9e94;
                uStack_9e90 = (uint)bVar18 * auVar67._48_4_ | !bVar18 * uStack_9e90;
                uStack_9e8c = (uint)bVar19 * auVar67._52_4_ | !bVar19 * uStack_9e8c;
                uStack_9e88 = (uint)bVar20 * auVar67._56_4_ | !bVar20 * uStack_9e88;
                uStack_9e84 = (uint)bVar21 * auVar67._60_4_ | !bVar21 * uStack_9e84;
                iVar65 = 2;
              }
              auVar68 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
              auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
              auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              auVar69 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar66 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
              auVar107 = ZEXT1664(auVar66);
              auVar67 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            }
            if (uVar59 < (uint)POPCOUNT(uVar54)) {
              do {
                uVar60 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_008daec8;
                  auVar75._4_4_ = uStack_9ebc;
                  auVar75._0_4_ = local_9ec0;
                  auVar75._8_4_ = uStack_9eb8;
                  auVar75._12_4_ = uStack_9eb4;
                  auVar75._16_4_ = uStack_9eb0;
                  auVar75._20_4_ = uStack_9eac;
                  auVar75._24_4_ = uStack_9ea8;
                  auVar75._28_4_ = uStack_9ea4;
                  auVar75._32_4_ = uStack_9ea0;
                  auVar75._36_4_ = uStack_9e9c;
                  auVar75._40_4_ = uStack_9e98;
                  auVar75._44_4_ = uStack_9e94;
                  auVar75._48_4_ = uStack_9e90;
                  auVar75._52_4_ = uStack_9e8c;
                  auVar75._56_4_ = uStack_9e88;
                  auVar75._60_4_ = uStack_9e84;
                  uVar24 = vcmpps_avx512f(auVar71,auVar75,9);
                  if ((short)uVar24 != 0) {
                    local_a890 = (ulong)(uVar60 & 0xf) - 8;
                    uVar60 = local_a8f4;
                    if (local_a890 != 0) {
                      local_a8f0 = ~local_a8f4;
                      uVar63 = 0;
                      do {
                        lVar57 = uVar63 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                        local_a8c0 = 0;
                        local_a8b8 = (ulong)(local_a8f0 & 0xffff);
                        for (uVar58 = local_a8b8; (uVar58 & 1) == 0;
                            uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                          local_a8c0 = local_a8c0 + 1;
                        }
                        local_a880._0_8_ = lVar57;
                        uVar58 = 0;
                        uVar60 = local_a8f0;
                        local_a888 = uVar63;
                        while( true ) {
                          if (*(int *)(lVar57 + 0x40 + uVar58 * 4) == -1) break;
                          local_a800 = (local_a8c8->scene->geometries).items;
                          pGVar2 = local_a800[*(uint *)(lVar57 + 0x30 + uVar58 * 4)].ptr;
                          auVar71 = vbroadcastss_avx512f(ZEXT416((uint)(pGVar2->time_range).lower));
                          auVar73 = vbroadcastss_avx512f(ZEXT416((uint)pGVar2->fnumTimeSegments));
                          auVar83 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar71);
                          auVar71 = vbroadcastss_avx512f
                                              (ZEXT416((uint)((pGVar2->time_range).upper -
                                                             auVar71._0_4_)));
                          auVar71 = vdivps_avx512f(auVar83,auVar71);
                          auVar71 = vmulps_avx512f(auVar73,auVar71);
                          auVar83 = vrndscaleps_avx512f(auVar71,1);
                          auVar66 = vaddss_avx512f(auVar73._0_16_,SUB6416(ZEXT464(0xbf800000),0));
                          auVar73 = vbroadcastss_avx512f(auVar66);
                          auVar73 = vminps_avx512f(auVar83,auVar73);
                          auVar73 = vmaxps_avx512f(auVar73,auVar107);
                          auVar83 = vsubps_avx512f(auVar71,auVar73);
                          auVar73 = vcvtps2dq_avx512f(auVar73);
                          auVar71 = vmovdqa64_avx512f(auVar73);
                          _local_a840 = auVar71;
                          auVar74 = vpbroadcastd_avx512f();
                          uVar24 = vpcmpd_avx512f(auVar74,auVar73,4);
                          local_a8d0 = CONCAT44(local_a8d0._4_4_,uVar60);
                          if (((ushort)uVar24 & (ushort)local_a8f0) == 0) {
                            lVar3 = *(long *)(*(long *)&pGVar2[2].numPrimitives +
                                             (long)*(int *)(local_a840 + local_a8c0 * 4) * 0x38);
                            lVar4 = *(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                             (long)*(int *)(local_a840 + local_a8c0 * 4) * 0x38);
                            uVar52 = (ulong)*(uint *)(lVar57 + uVar58 * 4);
                            uVar63 = (ulong)*(uint *)(lVar57 + 0x10 + uVar58 * 4);
                            auVar81 = vsubps_avx512f(auVar72,auVar83);
                            uVar54 = *(undefined4 *)(lVar4 + uVar52 * 4);
                            auVar87._4_4_ = uVar54;
                            auVar87._0_4_ = uVar54;
                            auVar87._8_4_ = uVar54;
                            auVar87._12_4_ = uVar54;
                            auVar87._16_4_ = uVar54;
                            auVar87._20_4_ = uVar54;
                            auVar87._24_4_ = uVar54;
                            auVar87._28_4_ = uVar54;
                            auVar87._32_4_ = uVar54;
                            auVar87._36_4_ = uVar54;
                            auVar87._40_4_ = uVar54;
                            auVar87._44_4_ = uVar54;
                            auVar87._48_4_ = uVar54;
                            auVar87._52_4_ = uVar54;
                            auVar87._56_4_ = uVar54;
                            auVar87._60_4_ = uVar54;
                            auVar73 = vmulps_avx512f(auVar83,auVar87);
                            uVar54 = *(undefined4 *)(lVar4 + 4 + uVar52 * 4);
                            auVar88._4_4_ = uVar54;
                            auVar88._0_4_ = uVar54;
                            auVar88._8_4_ = uVar54;
                            auVar88._12_4_ = uVar54;
                            auVar88._16_4_ = uVar54;
                            auVar88._20_4_ = uVar54;
                            auVar88._24_4_ = uVar54;
                            auVar88._28_4_ = uVar54;
                            auVar88._32_4_ = uVar54;
                            auVar88._36_4_ = uVar54;
                            auVar88._40_4_ = uVar54;
                            auVar88._44_4_ = uVar54;
                            auVar88._48_4_ = uVar54;
                            auVar88._52_4_ = uVar54;
                            auVar88._56_4_ = uVar54;
                            auVar88._60_4_ = uVar54;
                            auVar75 = vmulps_avx512f(auVar83,auVar88);
                            uVar54 = *(undefined4 *)(lVar4 + 8 + uVar52 * 4);
                            auVar89._4_4_ = uVar54;
                            auVar89._0_4_ = uVar54;
                            auVar89._8_4_ = uVar54;
                            auVar89._12_4_ = uVar54;
                            auVar89._16_4_ = uVar54;
                            auVar89._20_4_ = uVar54;
                            auVar89._24_4_ = uVar54;
                            auVar89._28_4_ = uVar54;
                            auVar89._32_4_ = uVar54;
                            auVar89._36_4_ = uVar54;
                            auVar89._40_4_ = uVar54;
                            auVar89._44_4_ = uVar54;
                            auVar89._48_4_ = uVar54;
                            auVar89._52_4_ = uVar54;
                            auVar89._56_4_ = uVar54;
                            auVar89._60_4_ = uVar54;
                            auVar76 = vmulps_avx512f(auVar83,auVar89);
                            uVar54 = *(undefined4 *)(lVar3 + uVar52 * 4);
                            auVar90._4_4_ = uVar54;
                            auVar90._0_4_ = uVar54;
                            auVar90._8_4_ = uVar54;
                            auVar90._12_4_ = uVar54;
                            auVar90._16_4_ = uVar54;
                            auVar90._20_4_ = uVar54;
                            auVar90._24_4_ = uVar54;
                            auVar90._28_4_ = uVar54;
                            auVar90._32_4_ = uVar54;
                            auVar90._36_4_ = uVar54;
                            auVar90._40_4_ = uVar54;
                            auVar90._44_4_ = uVar54;
                            auVar90._48_4_ = uVar54;
                            auVar90._52_4_ = uVar54;
                            auVar90._56_4_ = uVar54;
                            auVar90._60_4_ = uVar54;
                            auVar74 = vfmadd231ps_avx512f(auVar73,auVar81,auVar90);
                            uVar54 = *(undefined4 *)(lVar3 + 4 + uVar52 * 4);
                            auVar91._4_4_ = uVar54;
                            auVar91._0_4_ = uVar54;
                            auVar91._8_4_ = uVar54;
                            auVar91._12_4_ = uVar54;
                            auVar91._16_4_ = uVar54;
                            auVar91._20_4_ = uVar54;
                            auVar91._24_4_ = uVar54;
                            auVar91._28_4_ = uVar54;
                            auVar91._32_4_ = uVar54;
                            auVar91._36_4_ = uVar54;
                            auVar91._40_4_ = uVar54;
                            auVar91._44_4_ = uVar54;
                            auVar91._48_4_ = uVar54;
                            auVar91._52_4_ = uVar54;
                            auVar91._56_4_ = uVar54;
                            auVar91._60_4_ = uVar54;
                            auVar75 = vfmadd231ps_avx512f(auVar75,auVar81,auVar91);
                            uVar54 = *(undefined4 *)(lVar3 + 8 + uVar52 * 4);
                            auVar34._4_4_ = uVar54;
                            auVar34._0_4_ = uVar54;
                            auVar34._8_4_ = uVar54;
                            auVar34._12_4_ = uVar54;
                            auVar34._16_4_ = uVar54;
                            auVar34._20_4_ = uVar54;
                            auVar34._24_4_ = uVar54;
                            auVar34._28_4_ = uVar54;
                            auVar34._32_4_ = uVar54;
                            auVar34._36_4_ = uVar54;
                            auVar34._40_4_ = uVar54;
                            auVar34._44_4_ = uVar54;
                            auVar34._48_4_ = uVar54;
                            auVar34._52_4_ = uVar54;
                            auVar34._56_4_ = uVar54;
                            auVar34._60_4_ = uVar54;
                            auVar76 = vfmadd231ps_avx512f(auVar76,auVar81,auVar34);
                            uVar54 = *(undefined4 *)(lVar4 + uVar63 * 4);
                            auVar35._4_4_ = uVar54;
                            auVar35._0_4_ = uVar54;
                            auVar35._8_4_ = uVar54;
                            auVar35._12_4_ = uVar54;
                            auVar35._16_4_ = uVar54;
                            auVar35._20_4_ = uVar54;
                            auVar35._24_4_ = uVar54;
                            auVar35._28_4_ = uVar54;
                            auVar35._32_4_ = uVar54;
                            auVar35._36_4_ = uVar54;
                            auVar35._40_4_ = uVar54;
                            auVar35._44_4_ = uVar54;
                            auVar35._48_4_ = uVar54;
                            auVar35._52_4_ = uVar54;
                            auVar35._56_4_ = uVar54;
                            auVar35._60_4_ = uVar54;
                            auVar73 = vmulps_avx512f(auVar83,auVar35);
                            uVar54 = *(undefined4 *)(lVar4 + 4 + uVar63 * 4);
                            auVar36._4_4_ = uVar54;
                            auVar36._0_4_ = uVar54;
                            auVar36._8_4_ = uVar54;
                            auVar36._12_4_ = uVar54;
                            auVar36._16_4_ = uVar54;
                            auVar36._20_4_ = uVar54;
                            auVar36._24_4_ = uVar54;
                            auVar36._28_4_ = uVar54;
                            auVar36._32_4_ = uVar54;
                            auVar36._36_4_ = uVar54;
                            auVar36._40_4_ = uVar54;
                            auVar36._44_4_ = uVar54;
                            auVar36._48_4_ = uVar54;
                            auVar36._52_4_ = uVar54;
                            auVar36._56_4_ = uVar54;
                            auVar36._60_4_ = uVar54;
                            auVar78 = vmulps_avx512f(auVar83,auVar36);
                            uVar54 = *(undefined4 *)(lVar4 + 8 + uVar63 * 4);
                            auVar37._4_4_ = uVar54;
                            auVar37._0_4_ = uVar54;
                            auVar37._8_4_ = uVar54;
                            auVar37._12_4_ = uVar54;
                            auVar37._16_4_ = uVar54;
                            auVar37._20_4_ = uVar54;
                            auVar37._24_4_ = uVar54;
                            auVar37._28_4_ = uVar54;
                            auVar37._32_4_ = uVar54;
                            auVar37._36_4_ = uVar54;
                            auVar37._40_4_ = uVar54;
                            auVar37._44_4_ = uVar54;
                            auVar37._48_4_ = uVar54;
                            auVar37._52_4_ = uVar54;
                            auVar37._56_4_ = uVar54;
                            auVar37._60_4_ = uVar54;
                            auVar79 = vmulps_avx512f(auVar83,auVar37);
                            uVar54 = *(undefined4 *)(lVar3 + uVar63 * 4);
                            auVar38._4_4_ = uVar54;
                            auVar38._0_4_ = uVar54;
                            auVar38._8_4_ = uVar54;
                            auVar38._12_4_ = uVar54;
                            auVar38._16_4_ = uVar54;
                            auVar38._20_4_ = uVar54;
                            auVar38._24_4_ = uVar54;
                            auVar38._28_4_ = uVar54;
                            auVar38._32_4_ = uVar54;
                            auVar38._36_4_ = uVar54;
                            auVar38._40_4_ = uVar54;
                            auVar38._44_4_ = uVar54;
                            auVar38._48_4_ = uVar54;
                            auVar38._52_4_ = uVar54;
                            auVar38._56_4_ = uVar54;
                            auVar38._60_4_ = uVar54;
                            auVar77 = vfmadd231ps_avx512f(auVar73,auVar81,auVar38);
                            uVar54 = *(undefined4 *)(lVar3 + 4 + uVar63 * 4);
                            auVar39._4_4_ = uVar54;
                            auVar39._0_4_ = uVar54;
                            auVar39._8_4_ = uVar54;
                            auVar39._12_4_ = uVar54;
                            auVar39._16_4_ = uVar54;
                            auVar39._20_4_ = uVar54;
                            auVar39._24_4_ = uVar54;
                            auVar39._28_4_ = uVar54;
                            auVar39._32_4_ = uVar54;
                            auVar39._36_4_ = uVar54;
                            auVar39._40_4_ = uVar54;
                            auVar39._44_4_ = uVar54;
                            auVar39._48_4_ = uVar54;
                            auVar39._52_4_ = uVar54;
                            auVar39._56_4_ = uVar54;
                            auVar39._60_4_ = uVar54;
                            auVar78 = vfmadd231ps_avx512f(auVar78,auVar81,auVar39);
                            uVar54 = *(undefined4 *)(lVar3 + 8 + uVar63 * 4);
                            auVar40._4_4_ = uVar54;
                            auVar40._0_4_ = uVar54;
                            auVar40._8_4_ = uVar54;
                            auVar40._12_4_ = uVar54;
                            auVar40._16_4_ = uVar54;
                            auVar40._20_4_ = uVar54;
                            auVar40._24_4_ = uVar54;
                            auVar40._28_4_ = uVar54;
                            auVar40._32_4_ = uVar54;
                            auVar40._36_4_ = uVar54;
                            auVar40._40_4_ = uVar54;
                            auVar40._44_4_ = uVar54;
                            auVar40._48_4_ = uVar54;
                            auVar40._52_4_ = uVar54;
                            auVar40._56_4_ = uVar54;
                            auVar40._60_4_ = uVar54;
                            auVar79 = vfmadd231ps_avx512f(auVar79,auVar81,auVar40);
                            uVar63 = (ulong)*(uint *)(lVar57 + 0x20 + uVar58 * 4);
                            uVar54 = *(undefined4 *)(lVar4 + uVar63 * 4);
                            auVar41._4_4_ = uVar54;
                            auVar41._0_4_ = uVar54;
                            auVar41._8_4_ = uVar54;
                            auVar41._12_4_ = uVar54;
                            auVar41._16_4_ = uVar54;
                            auVar41._20_4_ = uVar54;
                            auVar41._24_4_ = uVar54;
                            auVar41._28_4_ = uVar54;
                            auVar41._32_4_ = uVar54;
                            auVar41._36_4_ = uVar54;
                            auVar41._40_4_ = uVar54;
                            auVar41._44_4_ = uVar54;
                            auVar41._48_4_ = uVar54;
                            auVar41._52_4_ = uVar54;
                            auVar41._56_4_ = uVar54;
                            auVar41._60_4_ = uVar54;
                            auVar73 = vmulps_avx512f(auVar83,auVar41);
                            uVar54 = *(undefined4 *)(lVar4 + 4 + uVar63 * 4);
                            auVar42._4_4_ = uVar54;
                            auVar42._0_4_ = uVar54;
                            auVar42._8_4_ = uVar54;
                            auVar42._12_4_ = uVar54;
                            auVar42._16_4_ = uVar54;
                            auVar42._20_4_ = uVar54;
                            auVar42._24_4_ = uVar54;
                            auVar42._28_4_ = uVar54;
                            auVar42._32_4_ = uVar54;
                            auVar42._36_4_ = uVar54;
                            auVar42._40_4_ = uVar54;
                            auVar42._44_4_ = uVar54;
                            auVar42._48_4_ = uVar54;
                            auVar42._52_4_ = uVar54;
                            auVar42._56_4_ = uVar54;
                            auVar42._60_4_ = uVar54;
                            auVar80 = vmulps_avx512f(auVar83,auVar42);
                            uVar54 = *(undefined4 *)(lVar4 + 8 + uVar63 * 4);
                            auVar43._4_4_ = uVar54;
                            auVar43._0_4_ = uVar54;
                            auVar43._8_4_ = uVar54;
                            auVar43._12_4_ = uVar54;
                            auVar43._16_4_ = uVar54;
                            auVar43._20_4_ = uVar54;
                            auVar43._24_4_ = uVar54;
                            auVar43._28_4_ = uVar54;
                            auVar43._32_4_ = uVar54;
                            auVar43._36_4_ = uVar54;
                            auVar43._40_4_ = uVar54;
                            auVar43._44_4_ = uVar54;
                            auVar43._48_4_ = uVar54;
                            auVar43._52_4_ = uVar54;
                            auVar43._56_4_ = uVar54;
                            auVar43._60_4_ = uVar54;
                            auVar83 = vmulps_avx512f(auVar83,auVar43);
                            uVar54 = *(undefined4 *)(lVar3 + uVar63 * 4);
                            auVar44._4_4_ = uVar54;
                            auVar44._0_4_ = uVar54;
                            auVar44._8_4_ = uVar54;
                            auVar44._12_4_ = uVar54;
                            auVar44._16_4_ = uVar54;
                            auVar44._20_4_ = uVar54;
                            auVar44._24_4_ = uVar54;
                            auVar44._28_4_ = uVar54;
                            auVar44._32_4_ = uVar54;
                            auVar44._36_4_ = uVar54;
                            auVar44._40_4_ = uVar54;
                            auVar44._44_4_ = uVar54;
                            auVar44._48_4_ = uVar54;
                            auVar44._52_4_ = uVar54;
                            auVar44._56_4_ = uVar54;
                            auVar44._60_4_ = uVar54;
                            auVar73 = vfmadd231ps_avx512f(auVar73,auVar81,auVar44);
                            uVar54 = *(undefined4 *)(lVar3 + 4 + uVar63 * 4);
                            auVar45._4_4_ = uVar54;
                            auVar45._0_4_ = uVar54;
                            auVar45._8_4_ = uVar54;
                            auVar45._12_4_ = uVar54;
                            auVar45._16_4_ = uVar54;
                            auVar45._20_4_ = uVar54;
                            auVar45._24_4_ = uVar54;
                            auVar45._28_4_ = uVar54;
                            auVar45._32_4_ = uVar54;
                            auVar45._36_4_ = uVar54;
                            auVar45._40_4_ = uVar54;
                            auVar45._44_4_ = uVar54;
                            auVar45._48_4_ = uVar54;
                            auVar45._52_4_ = uVar54;
                            auVar45._56_4_ = uVar54;
                            auVar45._60_4_ = uVar54;
                            auVar80 = vfmadd231ps_avx512f(auVar80,auVar81,auVar45);
                            uVar54 = *(undefined4 *)(lVar3 + 8 + uVar63 * 4);
                            auVar46._4_4_ = uVar54;
                            auVar46._0_4_ = uVar54;
                            auVar46._8_4_ = uVar54;
                            auVar46._12_4_ = uVar54;
                            auVar46._16_4_ = uVar54;
                            auVar46._20_4_ = uVar54;
                            auVar46._24_4_ = uVar54;
                            auVar46._28_4_ = uVar54;
                            auVar46._32_4_ = uVar54;
                            auVar46._36_4_ = uVar54;
                            auVar46._40_4_ = uVar54;
                            auVar46._44_4_ = uVar54;
                            auVar46._48_4_ = uVar54;
                            auVar46._52_4_ = uVar54;
                            auVar46._56_4_ = uVar54;
                            auVar46._60_4_ = uVar54;
                            auVar83 = vfmadd231ps_avx512f(auVar83,auVar81,auVar46);
                          }
                          else {
                            if ((ushort)local_a8f0 != 0) {
                              lVar57 = *(long *)&pGVar2[2].numPrimitives;
                              uVar56 = (ulong)*(uint *)(local_a880._0_8_ + uVar58 * 4);
                              uVar52 = local_a8b8;
                              uVar63 = local_a8c0;
                              do {
                                auVar66 = *(undefined1 (*) [16])
                                           (*(long *)(lVar57 + (long)*(int *)(local_a840 +
                                                                             uVar63 * 4) * 0x38) +
                                           uVar56 * 4);
                                auVar1 = *(undefined1 (*) [16])
                                          (*(long *)(lVar57 + 0x38 +
                                                    (long)*(int *)(local_a840 + uVar63 * 4) * 0x38)
                                          + uVar56 * 4);
                                *(int *)((long)&local_a6c0 + uVar63 * 4) = auVar66._0_4_;
                                uVar54 = vextractps_avx(auVar66,1);
                                *(undefined4 *)((long)&local_a680 + uVar63 * 4) = uVar54;
                                uVar54 = vextractps_avx(auVar66,2);
                                *(undefined4 *)((long)&local_a640 + uVar63 * 4) = uVar54;
                                *(int *)(local_a780 + uVar63 * 4) = auVar1._0_4_;
                                uVar54 = vextractps_avx(auVar1,1);
                                *(undefined4 *)(local_a740 + uVar63 * 4) = uVar54;
                                uVar54 = vextractps_avx(auVar1,2);
                                *(undefined4 *)(local_a700 + uVar63 * 4) = uVar54;
                                uVar52 = uVar52 ^ 1L << (uVar63 & 0x3f);
                                uVar63 = 0;
                                for (uVar64 = uVar52; (uVar64 & 1) == 0;
                                    uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                                  uVar63 = uVar63 + 1;
                                }
                              } while (uVar52 != 0);
                            }
                            auVar73 = vsubps_avx512f(auVar72,auVar83);
                            auVar76._8_8_ = uStack_a6b8;
                            auVar76._0_8_ = local_a6c0;
                            auVar76._16_8_ = uStack_a6b0;
                            auVar76._24_8_ = uStack_a6a8;
                            auVar76._32_8_ = uStack_a6a0;
                            auVar76._40_8_ = uStack_a698;
                            auVar76._48_8_ = uStack_a690;
                            auVar76._56_8_ = uStack_a688;
                            auVar74 = vmulps_avx512f(auVar73,auVar76);
                            auVar77._8_8_ = uStack_a678;
                            auVar77._0_8_ = local_a680;
                            auVar77._16_8_ = uStack_a670;
                            auVar77._24_8_ = uStack_a668;
                            auVar77._32_8_ = uStack_a660;
                            auVar77._40_8_ = uStack_a658;
                            auVar77._48_8_ = uStack_a650;
                            auVar77._56_8_ = uStack_a648;
                            auVar75 = vmulps_avx512f(auVar73,auVar77);
                            auVar78._8_8_ = uStack_a638;
                            auVar78._0_8_ = local_a640;
                            auVar78._16_8_ = uStack_a630;
                            auVar78._24_8_ = uStack_a628;
                            auVar78._32_8_ = uStack_a620;
                            auVar78._40_8_ = uStack_a618;
                            auVar78._48_8_ = uStack_a610;
                            auVar78._56_8_ = uStack_a608;
                            auVar76 = vmulps_avx512f(auVar73,auVar78);
                            auVar77 = vmulps_avx512f(auVar83,local_a780);
                            auVar78 = vmulps_avx512f(auVar83,local_a740);
                            auVar79 = vmulps_avx512f(auVar83,local_a700);
                            if ((ushort)local_a8f0 != 0) {
                              lVar57 = *(long *)&pGVar2[2].numPrimitives;
                              uVar56 = (ulong)*(uint *)(local_a880._0_8_ + 0x10 + uVar58 * 4);
                              uVar52 = local_a8b8;
                              uVar63 = local_a8c0;
                              do {
                                auVar66 = *(undefined1 (*) [16])
                                           (*(long *)(lVar57 + (long)*(int *)(local_a840 +
                                                                             uVar63 * 4) * 0x38) +
                                           uVar56 * 4);
                                auVar1 = *(undefined1 (*) [16])
                                          (*(long *)(lVar57 + 0x38 +
                                                    (long)*(int *)(local_a840 + uVar63 * 4) * 0x38)
                                          + uVar56 * 4);
                                *(int *)((long)&local_a6c0 + uVar63 * 4) = auVar66._0_4_;
                                uVar54 = vextractps_avx(auVar66,1);
                                *(undefined4 *)((long)&local_a680 + uVar63 * 4) = uVar54;
                                uVar54 = vextractps_avx(auVar66,2);
                                *(undefined4 *)((long)&local_a640 + uVar63 * 4) = uVar54;
                                *(int *)(local_a780 + uVar63 * 4) = auVar1._0_4_;
                                uVar54 = vextractps_avx(auVar1,1);
                                *(undefined4 *)(local_a740 + uVar63 * 4) = uVar54;
                                uVar54 = vextractps_avx(auVar1,2);
                                *(undefined4 *)(local_a700 + uVar63 * 4) = uVar54;
                                uVar52 = uVar52 ^ 1L << (uVar63 & 0x3f);
                                uVar63 = 0;
                                for (uVar64 = uVar52; (uVar64 & 1) == 0;
                                    uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                                  uVar63 = uVar63 + 1;
                                }
                              } while (uVar52 != 0);
                            }
                            auVar80._8_8_ = uStack_a6b8;
                            auVar80._0_8_ = local_a6c0;
                            auVar80._16_8_ = uStack_a6b0;
                            auVar80._24_8_ = uStack_a6a8;
                            auVar80._32_8_ = uStack_a6a0;
                            auVar80._40_8_ = uStack_a698;
                            auVar80._48_8_ = uStack_a690;
                            auVar80._56_8_ = uStack_a688;
                            auVar80 = vmulps_avx512f(auVar73,auVar80);
                            auVar81._8_8_ = uStack_a678;
                            auVar81._0_8_ = local_a680;
                            auVar81._16_8_ = uStack_a670;
                            auVar81._24_8_ = uStack_a668;
                            auVar81._32_8_ = uStack_a660;
                            auVar81._40_8_ = uStack_a658;
                            auVar81._48_8_ = uStack_a650;
                            auVar81._56_8_ = uStack_a648;
                            auVar81 = vmulps_avx512f(auVar73,auVar81);
                            auVar84._8_8_ = uStack_a638;
                            auVar84._0_8_ = local_a640;
                            auVar84._16_8_ = uStack_a630;
                            auVar84._24_8_ = uStack_a628;
                            auVar84._32_8_ = uStack_a620;
                            auVar84._40_8_ = uStack_a618;
                            auVar84._48_8_ = uStack_a610;
                            auVar84._56_8_ = uStack_a608;
                            auVar84 = vmulps_avx512f(auVar73,auVar84);
                            auVar85 = vmulps_avx512f(auVar83,local_a780);
                            auVar86 = vmulps_avx512f(auVar83,local_a740);
                            auVar87 = vmulps_avx512f(auVar83,local_a700);
                            if ((ushort)local_a8f0 != 0) {
                              lVar57 = *(long *)&pGVar2[2].numPrimitives;
                              uVar56 = (ulong)*(uint *)(local_a880._0_8_ + 0x20 + uVar58 * 4);
                              uVar52 = local_a8b8;
                              uVar63 = local_a8c0;
                              do {
                                auVar66 = *(undefined1 (*) [16])
                                           (*(long *)(lVar57 + (long)*(int *)(local_a840 +
                                                                             uVar63 * 4) * 0x38) +
                                           uVar56 * 4);
                                auVar1 = *(undefined1 (*) [16])
                                          (*(long *)(lVar57 + 0x38 +
                                                    (long)*(int *)(local_a840 + uVar63 * 4) * 0x38)
                                          + uVar56 * 4);
                                *(int *)((long)&local_a6c0 + uVar63 * 4) = auVar66._0_4_;
                                uVar54 = vextractps_avx(auVar66,1);
                                *(undefined4 *)((long)&local_a680 + uVar63 * 4) = uVar54;
                                uVar54 = vextractps_avx(auVar66,2);
                                *(undefined4 *)((long)&local_a640 + uVar63 * 4) = uVar54;
                                *(int *)(local_a780 + uVar63 * 4) = auVar1._0_4_;
                                uVar54 = vextractps_avx(auVar1,1);
                                *(undefined4 *)(local_a740 + uVar63 * 4) = uVar54;
                                uVar54 = vextractps_avx(auVar1,2);
                                *(undefined4 *)(local_a700 + uVar63 * 4) = uVar54;
                                uVar52 = uVar52 ^ 1L << (uVar63 & 0x3f);
                                uVar63 = 0;
                                for (uVar64 = uVar52; (uVar64 & 1) == 0;
                                    uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                                  uVar63 = uVar63 + 1;
                                }
                              } while (uVar52 != 0);
                            }
                            auVar74 = vaddps_avx512f(auVar74,auVar77);
                            auVar75 = vaddps_avx512f(auVar75,auVar78);
                            auVar76 = vaddps_avx512f(auVar76,auVar79);
                            auVar77 = vaddps_avx512f(auVar80,auVar85);
                            auVar78 = vaddps_avx512f(auVar81,auVar86);
                            auVar79._8_8_ = uStack_a6b8;
                            auVar79._0_8_ = local_a6c0;
                            auVar79._16_8_ = uStack_a6b0;
                            auVar79._24_8_ = uStack_a6a8;
                            auVar79._32_8_ = uStack_a6a0;
                            auVar79._40_8_ = uStack_a698;
                            auVar79._48_8_ = uStack_a690;
                            auVar79._56_8_ = uStack_a688;
                            auVar80 = vmulps_avx512f(auVar73,auVar79);
                            auVar85._8_8_ = uStack_a678;
                            auVar85._0_8_ = local_a680;
                            auVar85._16_8_ = uStack_a670;
                            auVar85._24_8_ = uStack_a668;
                            auVar85._32_8_ = uStack_a660;
                            auVar85._40_8_ = uStack_a658;
                            auVar85._48_8_ = uStack_a650;
                            auVar85._56_8_ = uStack_a648;
                            auVar81 = vmulps_avx512f(auVar73,auVar85);
                            auVar79 = vaddps_avx512f(auVar84,auVar87);
                            auVar86._8_8_ = uStack_a638;
                            auVar86._0_8_ = local_a640;
                            auVar86._16_8_ = uStack_a630;
                            auVar86._24_8_ = uStack_a628;
                            auVar86._32_8_ = uStack_a620;
                            auVar86._40_8_ = uStack_a618;
                            auVar86._48_8_ = uStack_a610;
                            auVar86._56_8_ = uStack_a608;
                            auVar84 = vmulps_avx512f(auVar73,auVar86);
                            auVar73 = vmulps_avx512f(auVar83,local_a780);
                            auVar73 = vaddps_avx512f(auVar80,auVar73);
                            auVar80 = vmulps_avx512f(auVar83,local_a740);
                            auVar80 = vaddps_avx512f(auVar81,auVar80);
                            auVar83 = vmulps_avx512f(auVar83,local_a700);
                            auVar83 = vaddps_avx512f(auVar84,auVar83);
                            lVar57 = local_a880._0_8_;
                          }
                          local_a790 = *(undefined8 *)(lVar57 + 0x30);
                          uStack_a788 = *(undefined8 *)(lVar57 + 0x38);
                          local_a7a0 = *(undefined8 *)(lVar57 + 0x40);
                          uStack_a798 = *(undefined8 *)(lVar57 + 0x48);
                          auVar77 = vsubps_avx512f(auVar74,auVar77);
                          auVar78 = vsubps_avx512f(auVar75,auVar78);
                          auVar79 = vsubps_avx512f(auVar76,auVar79);
                          auVar81 = vsubps_avx512f(auVar73,auVar74);
                          auVar80 = vsubps_avx512f(auVar80,auVar75);
                          auVar84 = vsubps_avx512f(auVar83,auVar76);
                          auVar73 = vmulps_avx512f(auVar78,auVar84);
                          auVar85 = vfmsub231ps_avx512f(auVar73,auVar80,auVar79);
                          auVar73 = vmulps_avx512f(auVar79,auVar81);
                          auVar86 = vfmsub231ps_avx512f(auVar73,auVar84,auVar77);
                          auVar87 = vmulps_avx512f(auVar77,auVar80);
                          auVar88 = vsubps_avx512f(auVar74,*(undefined1 (*) [64])ray);
                          auVar75 = vsubps_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0x40));
                          auVar76 = vsubps_avx512f(auVar76,*(undefined1 (*) [64])(ray + 0x80));
                          auVar73 = *(undefined1 (*) [64])(ray + 0x100);
                          auVar83 = *(undefined1 (*) [64])(ray + 0x140);
                          auVar74 = *(undefined1 (*) [64])(ray + 0x180);
                          auVar87 = vfmsub231ps_avx512f(auVar87,auVar81,auVar78);
                          auVar89 = vmulps_avx512f(auVar83,auVar76);
                          auVar89 = vfmsub231ps_avx512f(auVar89,auVar75,auVar74);
                          auVar90 = vmulps_avx512f(auVar74,auVar88);
                          auVar90 = vfmsub231ps_avx512f(auVar90,auVar76,auVar73);
                          auVar91 = vmulps_avx512f(auVar73,auVar75);
                          auVar91 = vfmsub231ps_avx512f(auVar91,auVar88,auVar83);
                          auVar74 = vmulps_avx512f(auVar87,auVar74);
                          auVar83 = vfmadd231ps_avx512f(auVar74,auVar86,auVar83);
                          auVar73 = vfmadd231ps_avx512f(auVar83,auVar85,auVar73);
                          auVar83 = vandps_avx512dq(auVar73,auVar67);
                          auVar74 = vmulps_avx512f(auVar84,auVar91);
                          auVar74 = vfmadd231ps_avx512f(auVar74,auVar90,auVar80);
                          auVar74 = vfmadd231ps_avx512f(auVar74,auVar89,auVar81);
                          auVar74 = vxorps_avx512dq(auVar83,auVar74);
                          uVar24 = vcmpps_avx512f(auVar74,auVar107,5);
                          uVar53 = (ushort)uVar24 & (ushort)uVar60;
                          if (uVar53 == 0) {
                            uVar53 = 0;
                          }
                          else {
                            auVar79 = vmulps_avx512f(auVar79,auVar91);
                            auVar78 = vfmadd213ps_avx512f(auVar90,auVar78,auVar79);
                            auVar77 = vfmadd213ps_avx512f(auVar89,auVar77,auVar78);
                            auVar77 = vxorps_avx512dq(auVar83,auVar77);
                            uVar24 = vcmpps_avx512f(auVar77,auVar107,5);
                            uVar53 = uVar53 & (ushort)uVar24;
                            if (uVar53 == 0) {
                              uVar53 = 0;
                            }
                            else {
                              auVar78 = vandps_avx512dq(auVar73,auVar68);
                              auVar79 = vsubps_avx512f(auVar78,auVar74);
                              uVar24 = vcmpps_avx512f(auVar79,auVar77,5);
                              uVar53 = uVar53 & (ushort)uVar24;
                              if (uVar53 == 0) {
LAB_008dadb8:
                                uVar53 = 0;
                              }
                              else {
                                auVar76 = vmulps_avx512f(auVar87,auVar76);
                                auVar75 = vfmadd213ps_avx512f(auVar75,auVar86,auVar76);
                                auVar75 = vfmadd213ps_avx512f(auVar88,auVar85,auVar75);
                                auVar83 = vxorps_avx512dq(auVar83,auVar75);
                                auVar75 = vmulps_avx512f(auVar78,*(undefined1 (*) [64])(ray + 0xc0))
                                ;
                                auVar76 = vmulps_avx512f(auVar78,*(undefined1 (*) [64])(ray + 0x200)
                                                        );
                                uVar24 = vcmpps_avx512f(auVar83,auVar76,2);
                                uVar25 = vcmpps_avx512f(auVar75,auVar83,1);
                                uVar53 = uVar53 & (ushort)uVar24 & (ushort)uVar25;
                                if (uVar53 == 0) goto LAB_008dadb8;
                                uVar24 = vcmpps_avx512f(auVar73,ZEXT1664(ZEXT816(0) << 0x40),4);
                                uVar53 = uVar53 & (ushort)uVar24;
                                if (uVar53 != 0) {
                                  local_a300 = auVar74;
                                  local_a340 = auVar77;
                                  local_a380 = auVar83;
                                  local_a3c0 = auVar78;
                                  local_a400 = auVar85;
                                  local_a440 = auVar86;
                                  local_a480 = auVar87;
                                }
                              }
                              auVar66 = vxorps_avx512vl(auVar107._0_16_,auVar107._0_16_);
                              auVar107 = ZEXT1664(auVar66);
                              lVar57 = local_a880._0_8_;
                            }
                          }
                          auVar66 = auVar107._0_16_;
                          pGVar2 = local_a800[*(uint *)((long)&local_a790 + uVar58 * 4)].ptr;
                          auVar73 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                          uVar24 = vptestmd_avx512f(auVar73,*(undefined1 (*) [64])(ray + 0x240));
                          uVar53 = (ushort)uVar24 & uVar53;
                          uVar51 = (uint)uVar53;
                          if (uVar53 != 0) {
                            if ((local_a8c8->args->filter != (RTCFilterFunctionN)0x0) ||
                               (lVar57 = local_a880._0_8_,
                               pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar73 = vrcp14ps_avx512f(local_a3c0);
                              auVar83 = vfnmadd213ps_avx512f(auVar73,local_a3c0,auVar72);
                              auVar73 = vfmadd132ps_avx512f(auVar83,auVar73,auVar73);
                              local_a600 = vmulps_avx512f(auVar73,local_a300);
                              local_a5c0 = vmulps_avx512f(auVar73,local_a340);
                              auVar83 = vpbroadcastd_avx512f();
                              auVar74 = vpbroadcastd_avx512f();
                              local_a6c0 = local_a400._0_8_;
                              uStack_a6b8 = local_a400._8_8_;
                              uStack_a6b0 = local_a400._16_8_;
                              uStack_a6a8 = local_a400._24_8_;
                              uStack_a6a0 = local_a400._32_8_;
                              uStack_a698 = local_a400._40_8_;
                              uStack_a690 = local_a400._48_8_;
                              uStack_a688 = local_a400._56_8_;
                              local_a680 = local_a440._0_8_;
                              uStack_a678 = local_a440._8_8_;
                              uStack_a670 = local_a440._16_8_;
                              uStack_a668 = local_a440._24_8_;
                              uStack_a660 = local_a440._32_8_;
                              uStack_a658 = local_a440._40_8_;
                              uStack_a650 = local_a440._48_8_;
                              uStack_a648 = local_a440._56_8_;
                              local_a640 = local_a480._0_8_;
                              uStack_a638 = local_a480._8_8_;
                              uStack_a630 = local_a480._16_8_;
                              uStack_a628 = local_a480._24_8_;
                              uStack_a620 = local_a480._32_8_;
                              uStack_a618 = local_a480._40_8_;
                              uStack_a610 = local_a480._48_8_;
                              uStack_a608 = local_a480._56_8_;
                              local_a580 = vmovdqa64_avx512f(auVar74);
                              local_a540 = vmovdqa64_avx512f(auVar83);
                              vpcmpeqd_avx2(local_a600._0_32_,local_a600._0_32_);
                              local_a500 = vbroadcastss_avx512f
                                                     (ZEXT416(local_a8c8->user->instID[0]));
                              local_a4c0 = vbroadcastss_avx512f
                                                     (ZEXT416(local_a8c8->user->instPrimID[0]));
                              local_a800._0_4_ = *(int *)(ray + 0x200);
                              local_a800._4_4_ = *(int *)(ray + 0x204);
                              iStack_a7f8 = *(int *)(ray + 0x208);
                              iStack_a7f4 = *(int *)(ray + 0x20c);
                              iStack_a7f0 = *(int *)(ray + 0x210);
                              iStack_a7ec = *(int *)(ray + 0x214);
                              iStack_a7e8 = *(int *)(ray + 0x218);
                              iStack_a7e4 = *(int *)(ray + 0x21c);
                              iStack_a7e0 = *(int *)(ray + 0x220);
                              iStack_a7dc = *(int *)(ray + 0x224);
                              iStack_a7d8 = *(int *)(ray + 0x228);
                              iStack_a7d4 = *(int *)(ray + 0x22c);
                              iStack_a7d0 = *(int *)(ray + 0x230);
                              iStack_a7cc = *(int *)(ray + 0x234);
                              iStack_a7c8 = *(int *)(ray + 0x238);
                              iStack_a7c4 = *(int *)(ray + 0x23c);
                              auVar73 = vmulps_avx512f(auVar73,local_a380);
                              bVar62 = (bool)((byte)uVar53 & 1);
                              bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                              bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                              bVar8 = (bool)((byte)(uVar53 >> 3) & 1);
                              bVar9 = (bool)((byte)(uVar53 >> 4) & 1);
                              bVar10 = (bool)((byte)(uVar53 >> 5) & 1);
                              bVar11 = (bool)((byte)(uVar53 >> 6) & 1);
                              bVar12 = (bool)((byte)(uVar53 >> 7) & 1);
                              bVar13 = (byte)(uVar53 >> 8);
                              bVar14 = (bool)(bVar13 >> 1 & 1);
                              bVar15 = (bool)(bVar13 >> 2 & 1);
                              bVar16 = (bool)(bVar13 >> 3 & 1);
                              bVar17 = (bool)(bVar13 >> 4 & 1);
                              bVar18 = (bool)(bVar13 >> 5 & 1);
                              bVar19 = (bool)(bVar13 >> 6 & 1);
                              *(uint *)(ray + 0x200) =
                                   (uint)bVar62 * auVar73._0_4_ | (uint)!bVar62 * (int)local_a800;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar6 * auVar73._4_4_ | (uint)!bVar6 * local_a800._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar7 * auVar73._8_4_ | (uint)!bVar7 * iStack_a7f8;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar8 * auVar73._12_4_ | (uint)!bVar8 * iStack_a7f4;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar9 * auVar73._16_4_ | (uint)!bVar9 * iStack_a7f0;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar10 * auVar73._20_4_ | (uint)!bVar10 * iStack_a7ec;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar11 * auVar73._24_4_ | (uint)!bVar11 * iStack_a7e8;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar12 * auVar73._28_4_ | (uint)!bVar12 * iStack_a7e4;
                              *(uint *)(ray + 0x220) =
                                   (uint)(bVar13 & 1) * auVar73._32_4_ |
                                   (uint)!(bool)(bVar13 & 1) * iStack_a7e0;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar14 * auVar73._36_4_ | (uint)!bVar14 * iStack_a7dc;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar15 * auVar73._40_4_ | (uint)!bVar15 * iStack_a7d8;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar16 * auVar73._44_4_ | (uint)!bVar16 * iStack_a7d4;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar17 * auVar73._48_4_ | (uint)!bVar17 * iStack_a7d0;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar18 * auVar73._52_4_ | (uint)!bVar18 * iStack_a7cc;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar19 * auVar73._56_4_ | (uint)!bVar19 * iStack_a7c8;
                              *(uint *)(ray + 0x23c) =
                                   (uint)(bVar13 >> 7) * auVar73._60_4_ |
                                   (uint)!(bool)(bVar13 >> 7) * iStack_a7c4;
                              auVar73 = vpmovm2d_avx512dq((ulong)uVar53);
                              local_a780 = vmovdqa64_avx512f(auVar73);
                              local_a840._8_8_ = pGVar2->userPtr;
                              local_a840._0_8_ = local_a780;
                              pRStack_a830 = local_a8c8->user;
                              pRStack_a828 = ray;
                              puStack_a820 = &local_a6c0;
                              auStack_a814 = auVar71._44_20_;
                              uStack_a818 = 0x10;
                              local_a8a8 = uVar58;
                              if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar2->occlusionFilterN)
                                          ((RTCFilterFunctionNArguments *)local_a840);
                                auVar67 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                                auVar66 = vxorps_avx512vl(auVar66,auVar66);
                                auVar107 = ZEXT1664(auVar66);
                                auVar69 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                auVar68 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                              }
                              auVar66 = auVar107._0_16_;
                              auVar71 = vmovdqa64_avx512f(local_a780);
                              uVar63 = vptestmd_avx512f(auVar71,auVar71);
                              lVar57 = local_a880._0_8_;
                              if ((short)uVar63 != 0) {
                                p_Var5 = local_a8c8->args->filter;
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((local_a8c8->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var5)((RTCFilterFunctionNArguments *)local_a840);
                                  auVar67 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                                  auVar66 = vxorps_avx512vl(auVar66,auVar66);
                                  auVar107 = ZEXT1664(auVar66);
                                  auVar69 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                  auVar70 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                  auVar72 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                                  auVar68 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                }
                                auVar71 = vmovdqa64_avx512f(local_a780);
                                uVar63 = vptestmd_avx512f(auVar71,auVar71);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar62 = (bool)((byte)uVar63 & 1);
                                bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
                                bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
                                bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
                                bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
                                bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                                bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                                bVar12 = (bool)((byte)(uVar63 >> 7) & 1);
                                bVar14 = (bool)((byte)(uVar63 >> 8) & 1);
                                bVar15 = (bool)((byte)(uVar63 >> 9) & 1);
                                bVar16 = (bool)((byte)(uVar63 >> 10) & 1);
                                bVar17 = (bool)((byte)(uVar63 >> 0xb) & 1);
                                bVar18 = (bool)((byte)(uVar63 >> 0xc) & 1);
                                bVar19 = (bool)((byte)(uVar63 >> 0xd) & 1);
                                bVar20 = (bool)((byte)(uVar63 >> 0xe) & 1);
                                bVar21 = SUB81(uVar63 >> 0xf,0);
                                *(uint *)(pRStack_a828 + 0x200) =
                                     (uint)bVar62 * auVar71._0_4_ |
                                     (uint)!bVar62 * *(int *)(pRStack_a828 + 0x200);
                                *(uint *)(pRStack_a828 + 0x204) =
                                     (uint)bVar6 * auVar71._4_4_ |
                                     (uint)!bVar6 * *(int *)(pRStack_a828 + 0x204);
                                *(uint *)(pRStack_a828 + 0x208) =
                                     (uint)bVar7 * auVar71._8_4_ |
                                     (uint)!bVar7 * *(int *)(pRStack_a828 + 0x208);
                                *(uint *)(pRStack_a828 + 0x20c) =
                                     (uint)bVar8 * auVar71._12_4_ |
                                     (uint)!bVar8 * *(int *)(pRStack_a828 + 0x20c);
                                *(uint *)(pRStack_a828 + 0x210) =
                                     (uint)bVar9 * auVar71._16_4_ |
                                     (uint)!bVar9 * *(int *)(pRStack_a828 + 0x210);
                                *(uint *)(pRStack_a828 + 0x214) =
                                     (uint)bVar10 * auVar71._20_4_ |
                                     (uint)!bVar10 * *(int *)(pRStack_a828 + 0x214);
                                *(uint *)(pRStack_a828 + 0x218) =
                                     (uint)bVar11 * auVar71._24_4_ |
                                     (uint)!bVar11 * *(int *)(pRStack_a828 + 0x218);
                                *(uint *)(pRStack_a828 + 0x21c) =
                                     (uint)bVar12 * auVar71._28_4_ |
                                     (uint)!bVar12 * *(int *)(pRStack_a828 + 0x21c);
                                *(uint *)(pRStack_a828 + 0x220) =
                                     (uint)bVar14 * auVar71._32_4_ |
                                     (uint)!bVar14 * *(int *)(pRStack_a828 + 0x220);
                                *(uint *)(pRStack_a828 + 0x224) =
                                     (uint)bVar15 * auVar71._36_4_ |
                                     (uint)!bVar15 * *(int *)(pRStack_a828 + 0x224);
                                *(uint *)(pRStack_a828 + 0x228) =
                                     (uint)bVar16 * auVar71._40_4_ |
                                     (uint)!bVar16 * *(int *)(pRStack_a828 + 0x228);
                                *(uint *)(pRStack_a828 + 0x22c) =
                                     (uint)bVar17 * auVar71._44_4_ |
                                     (uint)!bVar17 * *(int *)(pRStack_a828 + 0x22c);
                                *(uint *)(pRStack_a828 + 0x230) =
                                     (uint)bVar18 * auVar71._48_4_ |
                                     (uint)!bVar18 * *(int *)(pRStack_a828 + 0x230);
                                *(uint *)(pRStack_a828 + 0x234) =
                                     (uint)bVar19 * auVar71._52_4_ |
                                     (uint)!bVar19 * *(int *)(pRStack_a828 + 0x234);
                                *(uint *)(pRStack_a828 + 0x238) =
                                     (uint)bVar20 * auVar71._56_4_ |
                                     (uint)!bVar20 * *(int *)(pRStack_a828 + 0x238);
                                *(uint *)(pRStack_a828 + 0x23c) =
                                     (uint)bVar21 * auVar71._60_4_ |
                                     (uint)!bVar21 * *(int *)(pRStack_a828 + 0x23c);
                                lVar57 = local_a880._0_8_;
                              }
                              uVar51 = (uint)uVar63;
                              bVar62 = (bool)((byte)uVar63 & 1);
                              bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
                              bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
                              bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
                              bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
                              bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                              bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                              bVar12 = (bool)((byte)(uVar63 >> 7) & 1);
                              bVar14 = (bool)((byte)(uVar63 >> 8) & 1);
                              bVar15 = (bool)((byte)(uVar63 >> 9) & 1);
                              bVar16 = (bool)((byte)(uVar63 >> 10) & 1);
                              bVar17 = (bool)((byte)(uVar63 >> 0xb) & 1);
                              bVar18 = (bool)((byte)(uVar63 >> 0xc) & 1);
                              bVar19 = (bool)((byte)(uVar63 >> 0xd) & 1);
                              bVar20 = (bool)((byte)(uVar63 >> 0xe) & 1);
                              bVar21 = SUB81(uVar63 >> 0xf,0);
                              *(uint *)local_a898 =
                                   (uint)bVar62 * *(int *)local_a898 |
                                   (uint)!bVar62 * (int)local_a800;
                              *(uint *)(local_a898 + 4) =
                                   (uint)bVar6 * *(int *)(local_a898 + 4) |
                                   (uint)!bVar6 * local_a800._4_4_;
                              *(uint *)(local_a898 + 8) =
                                   (uint)bVar7 * *(int *)(local_a898 + 8) |
                                   (uint)!bVar7 * iStack_a7f8;
                              *(uint *)(local_a898 + 0xc) =
                                   (uint)bVar8 * *(int *)(local_a898 + 0xc) |
                                   (uint)!bVar8 * iStack_a7f4;
                              *(uint *)(local_a898 + 0x10) =
                                   (uint)bVar9 * *(int *)(local_a898 + 0x10) |
                                   (uint)!bVar9 * iStack_a7f0;
                              *(uint *)(local_a898 + 0x14) =
                                   (uint)bVar10 * *(int *)(local_a898 + 0x14) |
                                   (uint)!bVar10 * iStack_a7ec;
                              *(uint *)(local_a898 + 0x18) =
                                   (uint)bVar11 * *(int *)(local_a898 + 0x18) |
                                   (uint)!bVar11 * iStack_a7e8;
                              *(uint *)(local_a898 + 0x1c) =
                                   (uint)bVar12 * *(int *)(local_a898 + 0x1c) |
                                   (uint)!bVar12 * iStack_a7e4;
                              *(uint *)(local_a898 + 0x20) =
                                   (uint)bVar14 * *(int *)(local_a898 + 0x20) |
                                   (uint)!bVar14 * iStack_a7e0;
                              *(uint *)(local_a898 + 0x24) =
                                   (uint)bVar15 * *(int *)(local_a898 + 0x24) |
                                   (uint)!bVar15 * iStack_a7dc;
                              *(uint *)(local_a898 + 0x28) =
                                   (uint)bVar16 * *(int *)(local_a898 + 0x28) |
                                   (uint)!bVar16 * iStack_a7d8;
                              *(uint *)(local_a898 + 0x2c) =
                                   (uint)bVar17 * *(int *)(local_a898 + 0x2c) |
                                   (uint)!bVar17 * iStack_a7d4;
                              *(uint *)(local_a898 + 0x30) =
                                   (uint)bVar18 * *(int *)(local_a898 + 0x30) |
                                   (uint)!bVar18 * iStack_a7d0;
                              *(uint *)(local_a898 + 0x34) =
                                   (uint)bVar19 * *(int *)(local_a898 + 0x34) |
                                   (uint)!bVar19 * iStack_a7cc;
                              *(uint *)(local_a898 + 0x38) =
                                   (uint)bVar20 * *(int *)(local_a898 + 0x38) |
                                   (uint)!bVar20 * iStack_a7c8;
                              *(uint *)(local_a898 + 0x3c) =
                                   (uint)bVar21 * *(int *)(local_a898 + 0x3c) |
                                   (uint)!bVar21 * iStack_a7c4;
                              uVar58 = local_a8a8;
                              uVar60 = (uint)local_a8d0;
                            }
                            uVar60 = ~uVar51 & uVar60;
                          }
                          if (((short)uVar60 == 0) ||
                             (bVar62 = 2 < uVar58, uVar58 = uVar58 + 1, bVar62)) break;
                        }
                        uVar53 = (ushort)local_a8f0 & (ushort)uVar60;
                        local_a8f0 = CONCAT22((short)(local_a8f0 >> 0x10),uVar53);
                      } while ((uVar53 != 0) && (uVar63 = local_a888 + 1, uVar63 < local_a890));
                      uVar60 = ~local_a8f0;
                    }
                    local_a8f4 = local_a8f4 | uVar60;
                    if ((short)local_a8f4 == -1) goto LAB_008daec8;
                    auVar71 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar62 = (bool)((byte)local_a8f4 & 1);
                    bVar6 = (bool)((byte)(local_a8f4 >> 1) & 1);
                    bVar7 = (bool)((byte)(local_a8f4 >> 2) & 1);
                    bVar8 = (bool)((byte)(local_a8f4 >> 3) & 1);
                    bVar9 = (bool)((byte)(local_a8f4 >> 4) & 1);
                    bVar10 = (bool)((byte)(local_a8f4 >> 5) & 1);
                    bVar11 = (bool)((byte)(local_a8f4 >> 6) & 1);
                    bVar12 = (bool)((byte)(local_a8f4 >> 7) & 1);
                    bVar14 = (bool)((byte)(local_a8f4 >> 8) & 1);
                    bVar15 = (bool)((byte)(local_a8f4 >> 9) & 1);
                    bVar16 = (bool)((byte)(local_a8f4 >> 10) & 1);
                    bVar17 = (bool)((byte)(local_a8f4 >> 0xb) & 1);
                    bVar18 = (bool)((byte)(local_a8f4 >> 0xc) & 1);
                    bVar19 = (bool)((byte)(local_a8f4 >> 0xd) & 1);
                    bVar20 = (bool)((byte)(local_a8f4 >> 0xe) & 1);
                    bVar21 = (bool)((byte)(local_a8f4 >> 0xf) & 1);
                    local_9ec0 = (uint)bVar62 * auVar71._0_4_ | !bVar62 * local_9ec0;
                    uStack_9ebc = (uint)bVar6 * auVar71._4_4_ | !bVar6 * uStack_9ebc;
                    uStack_9eb8 = (uint)bVar7 * auVar71._8_4_ | !bVar7 * uStack_9eb8;
                    uStack_9eb4 = (uint)bVar8 * auVar71._12_4_ | !bVar8 * uStack_9eb4;
                    uStack_9eb0 = (uint)bVar9 * auVar71._16_4_ | !bVar9 * uStack_9eb0;
                    uStack_9eac = (uint)bVar10 * auVar71._20_4_ | !bVar10 * uStack_9eac;
                    uStack_9ea8 = (uint)bVar11 * auVar71._24_4_ | !bVar11 * uStack_9ea8;
                    uStack_9ea4 = (uint)bVar12 * auVar71._28_4_ | !bVar12 * uStack_9ea4;
                    uStack_9ea0 = (uint)bVar14 * auVar71._32_4_ | !bVar14 * uStack_9ea0;
                    uStack_9e9c = (uint)bVar15 * auVar71._36_4_ | !bVar15 * uStack_9e9c;
                    uStack_9e98 = (uint)bVar16 * auVar71._40_4_ | !bVar16 * uStack_9e98;
                    uStack_9e94 = (uint)bVar17 * auVar71._44_4_ | !bVar17 * uStack_9e94;
                    uStack_9e90 = (uint)bVar18 * auVar71._48_4_ | !bVar18 * uStack_9e90;
                    uStack_9e8c = (uint)bVar19 * auVar71._52_4_ | !bVar19 * uStack_9e8c;
                    uStack_9e88 = (uint)bVar20 * auVar71._56_4_ | !bVar20 * uStack_9e88;
                    uStack_9e84 = (uint)bVar21 * auVar71._60_4_ | !bVar21 * uStack_9e84;
                    iVar65 = 0;
                    break;
                  }
                  goto LAB_008daed9;
                }
                auVar48._4_4_ = uStack_9ebc;
                auVar48._0_4_ = local_9ec0;
                auVar48._8_4_ = uStack_9eb8;
                auVar48._12_4_ = uStack_9eb4;
                auVar48._16_4_ = uStack_9eb0;
                auVar48._20_4_ = uStack_9eac;
                auVar48._24_4_ = uStack_9ea8;
                auVar48._28_4_ = uStack_9ea4;
                auVar48._32_4_ = uStack_9ea0;
                auVar48._36_4_ = uStack_9e9c;
                auVar48._40_4_ = uStack_9e98;
                auVar48._44_4_ = uStack_9e94;
                auVar48._48_4_ = uStack_9e90;
                auVar48._52_4_ = uStack_9e8c;
                auVar48._56_4_ = uStack_9e88;
                auVar48._60_4_ = uStack_9e84;
                uVar52 = root.ptr & 0xfffffffffffffff0;
                uVar63 = 0;
                uVar58 = 8;
                auVar73 = auVar69;
                do {
                  uVar56 = *(ulong *)(uVar52 + uVar63 * 8);
                  root.ptr = uVar58;
                  auVar82 = auVar73;
                  if (uVar56 != 8) {
                    auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x100 + uVar63 * 4)));
                    auVar83 = *(undefined1 (*) [64])(ray + 0x1c0);
                    uVar54 = *(undefined4 *)(uVar52 + 0x40 + uVar63 * 4);
                    auVar26._4_4_ = uVar54;
                    auVar26._0_4_ = uVar54;
                    auVar26._8_4_ = uVar54;
                    auVar26._12_4_ = uVar54;
                    auVar26._16_4_ = uVar54;
                    auVar26._20_4_ = uVar54;
                    auVar26._24_4_ = uVar54;
                    auVar26._28_4_ = uVar54;
                    auVar26._32_4_ = uVar54;
                    auVar26._36_4_ = uVar54;
                    auVar26._40_4_ = uVar54;
                    auVar26._44_4_ = uVar54;
                    auVar26._48_4_ = uVar54;
                    auVar26._52_4_ = uVar54;
                    auVar26._56_4_ = uVar54;
                    auVar26._60_4_ = uVar54;
                    auVar74 = vfmadd213ps_avx512f(auVar74,auVar83,auVar26);
                    auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x140 + uVar63 * 4)));
                    uVar54 = *(undefined4 *)(uVar52 + 0x80 + uVar63 * 4);
                    auVar27._4_4_ = uVar54;
                    auVar27._0_4_ = uVar54;
                    auVar27._8_4_ = uVar54;
                    auVar27._12_4_ = uVar54;
                    auVar27._16_4_ = uVar54;
                    auVar27._20_4_ = uVar54;
                    auVar27._24_4_ = uVar54;
                    auVar27._28_4_ = uVar54;
                    auVar27._32_4_ = uVar54;
                    auVar27._36_4_ = uVar54;
                    auVar27._40_4_ = uVar54;
                    auVar27._44_4_ = uVar54;
                    auVar27._48_4_ = uVar54;
                    auVar27._52_4_ = uVar54;
                    auVar27._56_4_ = uVar54;
                    auVar27._60_4_ = uVar54;
                    auVar75 = vfmadd213ps_avx512f(auVar75,auVar83,auVar27);
                    auVar76 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x180 + uVar63 * 4)));
                    uVar54 = *(undefined4 *)(uVar52 + 0xc0 + uVar63 * 4);
                    auVar28._4_4_ = uVar54;
                    auVar28._0_4_ = uVar54;
                    auVar28._8_4_ = uVar54;
                    auVar28._12_4_ = uVar54;
                    auVar28._16_4_ = uVar54;
                    auVar28._20_4_ = uVar54;
                    auVar28._24_4_ = uVar54;
                    auVar28._28_4_ = uVar54;
                    auVar28._32_4_ = uVar54;
                    auVar28._36_4_ = uVar54;
                    auVar28._40_4_ = uVar54;
                    auVar28._44_4_ = uVar54;
                    auVar28._48_4_ = uVar54;
                    auVar28._52_4_ = uVar54;
                    auVar28._56_4_ = uVar54;
                    auVar28._60_4_ = uVar54;
                    auVar76 = vfmadd213ps_avx512f(auVar76,auVar83,auVar28);
                    auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x120 + uVar63 * 4)));
                    uVar54 = *(undefined4 *)(uVar52 + 0x60 + uVar63 * 4);
                    auVar29._4_4_ = uVar54;
                    auVar29._0_4_ = uVar54;
                    auVar29._8_4_ = uVar54;
                    auVar29._12_4_ = uVar54;
                    auVar29._16_4_ = uVar54;
                    auVar29._20_4_ = uVar54;
                    auVar29._24_4_ = uVar54;
                    auVar29._28_4_ = uVar54;
                    auVar29._32_4_ = uVar54;
                    auVar29._36_4_ = uVar54;
                    auVar29._40_4_ = uVar54;
                    auVar29._44_4_ = uVar54;
                    auVar29._48_4_ = uVar54;
                    auVar29._52_4_ = uVar54;
                    auVar29._56_4_ = uVar54;
                    auVar29._60_4_ = uVar54;
                    auVar77 = vfmadd213ps_avx512f(auVar77,auVar83,auVar29);
                    auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x160 + uVar63 * 4)));
                    uVar54 = *(undefined4 *)(uVar52 + 0xa0 + uVar63 * 4);
                    auVar30._4_4_ = uVar54;
                    auVar30._0_4_ = uVar54;
                    auVar30._8_4_ = uVar54;
                    auVar30._12_4_ = uVar54;
                    auVar30._16_4_ = uVar54;
                    auVar30._20_4_ = uVar54;
                    auVar30._24_4_ = uVar54;
                    auVar30._28_4_ = uVar54;
                    auVar30._32_4_ = uVar54;
                    auVar30._36_4_ = uVar54;
                    auVar30._40_4_ = uVar54;
                    auVar30._44_4_ = uVar54;
                    auVar30._48_4_ = uVar54;
                    auVar30._52_4_ = uVar54;
                    auVar30._56_4_ = uVar54;
                    auVar30._60_4_ = uVar54;
                    auVar78 = vfmadd213ps_avx512f(auVar78,auVar83,auVar30);
                    auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x1a0 + uVar63 * 4)));
                    uVar54 = *(undefined4 *)(uVar52 + 0xe0 + uVar63 * 4);
                    auVar31._4_4_ = uVar54;
                    auVar31._0_4_ = uVar54;
                    auVar31._8_4_ = uVar54;
                    auVar31._12_4_ = uVar54;
                    auVar31._16_4_ = uVar54;
                    auVar31._20_4_ = uVar54;
                    auVar31._24_4_ = uVar54;
                    auVar31._28_4_ = uVar54;
                    auVar31._32_4_ = uVar54;
                    auVar31._36_4_ = uVar54;
                    auVar31._40_4_ = uVar54;
                    auVar31._44_4_ = uVar54;
                    auVar31._48_4_ = uVar54;
                    auVar31._52_4_ = uVar54;
                    auVar31._56_4_ = uVar54;
                    auVar31._60_4_ = uVar54;
                    auVar79 = vfmadd213ps_avx512f(auVar79,auVar83,auVar31);
                    auVar74 = vfmsub213ps_avx512f(auVar74,local_a140,local_a080);
                    auVar75 = vfmsub213ps_avx512f(auVar75,local_a100,local_a040);
                    auVar76 = vfmsub213ps_avx512f(auVar76,local_a0c0,local_a000);
                    auVar77 = vfmsub213ps_avx512f(auVar77,local_a140,local_a080);
                    auVar78 = vfmsub213ps_avx512f(auVar78,local_a100,local_a040);
                    auVar79 = vfmsub213ps_avx512f(auVar79,local_a0c0,local_a000);
                    auVar80 = vpminsd_avx512f(auVar74,auVar77);
                    auVar81 = vpminsd_avx512f(auVar75,auVar78);
                    auVar80 = vpmaxsd_avx512f(auVar80,auVar81);
                    auVar81 = vpminsd_avx512f(auVar76,auVar79);
                    auVar80 = vpmaxsd_avx512f(auVar80,auVar81);
                    auVar74 = vpmaxsd_avx512f(auVar74,auVar77);
                    auVar75 = vpmaxsd_avx512f(auVar75,auVar78);
                    auVar74 = vpminsd_avx512f(auVar74,auVar75);
                    auVar75 = vpmaxsd_avx512f(auVar76,auVar79);
                    auVar74 = vpminsd_avx512f(auVar74,auVar75);
                    auVar47._4_4_ = uStack_9efc;
                    auVar47._0_4_ = local_9f00;
                    auVar47._8_4_ = uStack_9ef8;
                    auVar47._12_4_ = uStack_9ef4;
                    auVar47._16_4_ = uStack_9ef0;
                    auVar47._20_4_ = uStack_9eec;
                    auVar47._24_4_ = uStack_9ee8;
                    auVar47._28_4_ = uStack_9ee4;
                    auVar47._32_4_ = uStack_9ee0;
                    auVar47._36_4_ = uStack_9edc;
                    auVar47._40_4_ = uStack_9ed8;
                    auVar47._44_4_ = uStack_9ed4;
                    auVar47._48_4_ = uStack_9ed0;
                    auVar47._52_4_ = uStack_9ecc;
                    auVar47._56_4_ = uStack_9ec8;
                    auVar47._60_4_ = uStack_9ec4;
                    auVar75 = vpmaxsd_avx512f(auVar80,auVar47);
                    auVar49._4_4_ = uStack_9ebc;
                    auVar49._0_4_ = local_9ec0;
                    auVar49._8_4_ = uStack_9eb8;
                    auVar49._12_4_ = uStack_9eb4;
                    auVar49._16_4_ = uStack_9eb0;
                    auVar49._20_4_ = uStack_9eac;
                    auVar49._24_4_ = uStack_9ea8;
                    auVar49._28_4_ = uStack_9ea4;
                    auVar49._32_4_ = uStack_9ea0;
                    auVar49._36_4_ = uStack_9e9c;
                    auVar49._40_4_ = uStack_9e98;
                    auVar49._44_4_ = uStack_9e94;
                    auVar49._48_4_ = uStack_9e90;
                    auVar49._52_4_ = uStack_9e8c;
                    auVar49._56_4_ = uStack_9e88;
                    auVar49._60_4_ = uStack_9e84;
                    auVar74 = vpminsd_avx512f(auVar74,auVar49);
                    uVar64 = vcmpps_avx512f(auVar75,auVar74,2);
                    if ((uVar60 & 7) == 6) {
                      uVar54 = *(undefined4 *)(uVar52 + 0x1c0 + uVar63 * 4);
                      auVar32._4_4_ = uVar54;
                      auVar32._0_4_ = uVar54;
                      auVar32._8_4_ = uVar54;
                      auVar32._12_4_ = uVar54;
                      auVar32._16_4_ = uVar54;
                      auVar32._20_4_ = uVar54;
                      auVar32._24_4_ = uVar54;
                      auVar32._28_4_ = uVar54;
                      auVar32._32_4_ = uVar54;
                      auVar32._36_4_ = uVar54;
                      auVar32._40_4_ = uVar54;
                      auVar32._44_4_ = uVar54;
                      auVar32._48_4_ = uVar54;
                      auVar32._52_4_ = uVar54;
                      auVar32._56_4_ = uVar54;
                      auVar32._60_4_ = uVar54;
                      uVar22 = vcmpps_avx512f(auVar83,auVar32,0xd);
                      uVar54 = *(undefined4 *)(uVar52 + 0x1e0 + uVar63 * 4);
                      auVar33._4_4_ = uVar54;
                      auVar33._0_4_ = uVar54;
                      auVar33._8_4_ = uVar54;
                      auVar33._12_4_ = uVar54;
                      auVar33._16_4_ = uVar54;
                      auVar33._20_4_ = uVar54;
                      auVar33._24_4_ = uVar54;
                      auVar33._28_4_ = uVar54;
                      auVar33._32_4_ = uVar54;
                      auVar33._36_4_ = uVar54;
                      auVar33._40_4_ = uVar54;
                      auVar33._44_4_ = uVar54;
                      auVar33._48_4_ = uVar54;
                      auVar33._52_4_ = uVar54;
                      auVar33._56_4_ = uVar54;
                      auVar33._60_4_ = uVar54;
                      uVar23 = vcmpps_avx512f(auVar83,auVar33,1);
                      uVar64 = uVar64 & uVar22 & uVar23;
                    }
                    uVar22 = vcmpps_avx512f(auVar48,auVar71,6);
                    uVar64 = uVar64 & uVar22;
                    if ((short)uVar64 != 0) {
                      auVar74 = vblendmps_avx512f(auVar69,auVar80);
                      bVar62 = (bool)((byte)uVar64 & 1);
                      auVar82._0_4_ = (uint)bVar62 * auVar74._0_4_ | (uint)!bVar62 * auVar83._0_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 1) & 1);
                      auVar82._4_4_ = (uint)bVar62 * auVar74._4_4_ | (uint)!bVar62 * auVar83._4_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 2) & 1);
                      auVar82._8_4_ = (uint)bVar62 * auVar74._8_4_ | (uint)!bVar62 * auVar83._8_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 3) & 1);
                      auVar82._12_4_ =
                           (uint)bVar62 * auVar74._12_4_ | (uint)!bVar62 * auVar83._12_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 4) & 1);
                      auVar82._16_4_ =
                           (uint)bVar62 * auVar74._16_4_ | (uint)!bVar62 * auVar83._16_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 5) & 1);
                      auVar82._20_4_ =
                           (uint)bVar62 * auVar74._20_4_ | (uint)!bVar62 * auVar83._20_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 6) & 1);
                      auVar82._24_4_ =
                           (uint)bVar62 * auVar74._24_4_ | (uint)!bVar62 * auVar83._24_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 7) & 1);
                      auVar82._28_4_ =
                           (uint)bVar62 * auVar74._28_4_ | (uint)!bVar62 * auVar83._28_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 8) & 1);
                      auVar82._32_4_ =
                           (uint)bVar62 * auVar74._32_4_ | (uint)!bVar62 * auVar83._32_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 9) & 1);
                      auVar82._36_4_ =
                           (uint)bVar62 * auVar74._36_4_ | (uint)!bVar62 * auVar83._36_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 10) & 1);
                      auVar82._40_4_ =
                           (uint)bVar62 * auVar74._40_4_ | (uint)!bVar62 * auVar83._40_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 0xb) & 1);
                      auVar82._44_4_ =
                           (uint)bVar62 * auVar74._44_4_ | (uint)!bVar62 * auVar83._44_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 0xc) & 1);
                      auVar82._48_4_ =
                           (uint)bVar62 * auVar74._48_4_ | (uint)!bVar62 * auVar83._48_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 0xd) & 1);
                      auVar82._52_4_ =
                           (uint)bVar62 * auVar74._52_4_ | (uint)!bVar62 * auVar83._52_4_;
                      bVar62 = (bool)((byte)(uVar64 >> 0xe) & 1);
                      auVar82._56_4_ =
                           (uint)bVar62 * auVar74._56_4_ | (uint)!bVar62 * auVar83._56_4_;
                      bVar62 = SUB81(uVar64 >> 0xf,0);
                      auVar82._60_4_ =
                           (uint)bVar62 * auVar74._60_4_ | (uint)!bVar62 * auVar83._60_4_;
                      root.ptr = uVar56;
                      if (uVar58 != 8) {
                        *puVar61 = uVar58;
                        puVar61 = puVar61 + 1;
                        *pauVar55 = auVar73;
                        pauVar55 = pauVar55 + 1;
                      }
                    }
                  }
                } while ((uVar56 != 8) &&
                        (bVar62 = uVar63 < 7, uVar63 = uVar63 + 1, uVar58 = root.ptr,
                        auVar73 = auVar82, bVar62));
                iVar65 = 0;
                if (root.ptr == 8) {
LAB_008da42d:
                  bVar62 = false;
                  iVar65 = 4;
                }
                else {
                  auVar50._4_4_ = uStack_9ebc;
                  auVar50._0_4_ = local_9ec0;
                  auVar50._8_4_ = uStack_9eb8;
                  auVar50._12_4_ = uStack_9eb4;
                  auVar50._16_4_ = uStack_9eb0;
                  auVar50._20_4_ = uStack_9eac;
                  auVar50._24_4_ = uStack_9ea8;
                  auVar50._28_4_ = uStack_9ea4;
                  auVar50._32_4_ = uStack_9ea0;
                  auVar50._36_4_ = uStack_9e9c;
                  auVar50._40_4_ = uStack_9e98;
                  auVar50._44_4_ = uStack_9e94;
                  auVar50._48_4_ = uStack_9e90;
                  auVar50._52_4_ = uStack_9e8c;
                  auVar50._56_4_ = uStack_9e88;
                  auVar50._60_4_ = uStack_9e84;
                  uVar24 = vcmpps_avx512f(auVar82,auVar50,9);
                  bVar62 = true;
                  if ((uint)POPCOUNT((int)uVar24) <= uVar59) {
                    *puVar61 = root.ptr;
                    puVar61 = puVar61 + 1;
                    *pauVar55 = auVar82;
                    pauVar55 = pauVar55 + 1;
                    goto LAB_008da42d;
                  }
                }
                auVar71 = auVar82;
              } while (bVar62);
            }
          }
        }
      } while (iVar65 != 3);
      local_a8f4 = local_a8f4 & local_a8ac;
      bVar62 = (bool)((byte)local_a8f4 & 1);
      bVar6 = (bool)((byte)(local_a8f4 >> 1) & 1);
      bVar7 = (bool)((byte)(local_a8f4 >> 2) & 1);
      bVar8 = (bool)((byte)(local_a8f4 >> 3) & 1);
      bVar9 = (bool)((byte)(local_a8f4 >> 4) & 1);
      bVar10 = (bool)((byte)(local_a8f4 >> 5) & 1);
      bVar11 = (bool)((byte)(local_a8f4 >> 6) & 1);
      bVar12 = (bool)((byte)(local_a8f4 >> 7) & 1);
      bVar14 = (bool)((byte)(local_a8f4 >> 8) & 1);
      bVar15 = (bool)((byte)(local_a8f4 >> 9) & 1);
      bVar16 = (bool)((byte)(local_a8f4 >> 10) & 1);
      bVar17 = (bool)((byte)(local_a8f4 >> 0xb) & 1);
      bVar18 = (bool)((byte)(local_a8f4 >> 0xc) & 1);
      bVar19 = (bool)((byte)(local_a8f4 >> 0xd) & 1);
      bVar20 = (bool)((byte)(local_a8f4 >> 0xe) & 1);
      bVar21 = (bool)((byte)(local_a8f4 >> 0xf) & 1);
      *(uint *)local_a898 = (uint)bVar62 * auVar70._0_4_ | (uint)!bVar62 * *(int *)local_a898;
      *(uint *)(local_a898 + 4) =
           (uint)bVar6 * auVar70._4_4_ | (uint)!bVar6 * *(int *)(local_a898 + 4);
      *(uint *)(local_a898 + 8) =
           (uint)bVar7 * auVar70._8_4_ | (uint)!bVar7 * *(int *)(local_a898 + 8);
      *(uint *)(local_a898 + 0xc) =
           (uint)bVar8 * auVar70._12_4_ | (uint)!bVar8 * *(int *)(local_a898 + 0xc);
      *(uint *)(local_a898 + 0x10) =
           (uint)bVar9 * auVar70._16_4_ | (uint)!bVar9 * *(int *)(local_a898 + 0x10);
      *(uint *)(local_a898 + 0x14) =
           (uint)bVar10 * auVar70._20_4_ | (uint)!bVar10 * *(int *)(local_a898 + 0x14);
      *(uint *)(local_a898 + 0x18) =
           (uint)bVar11 * auVar70._24_4_ | (uint)!bVar11 * *(int *)(local_a898 + 0x18);
      *(uint *)(local_a898 + 0x1c) =
           (uint)bVar12 * auVar70._28_4_ | (uint)!bVar12 * *(int *)(local_a898 + 0x1c);
      *(uint *)(local_a898 + 0x20) =
           (uint)bVar14 * auVar70._32_4_ | (uint)!bVar14 * *(int *)(local_a898 + 0x20);
      *(uint *)(local_a898 + 0x24) =
           (uint)bVar15 * auVar70._36_4_ | (uint)!bVar15 * *(int *)(local_a898 + 0x24);
      *(uint *)(local_a898 + 0x28) =
           (uint)bVar16 * auVar70._40_4_ | (uint)!bVar16 * *(int *)(local_a898 + 0x28);
      *(uint *)(local_a898 + 0x2c) =
           (uint)bVar17 * auVar70._44_4_ | (uint)!bVar17 * *(int *)(local_a898 + 0x2c);
      *(uint *)(local_a898 + 0x30) =
           (uint)bVar18 * auVar70._48_4_ | (uint)!bVar18 * *(int *)(local_a898 + 0x30);
      *(uint *)(local_a898 + 0x34) =
           (uint)bVar19 * auVar70._52_4_ | (uint)!bVar19 * *(int *)(local_a898 + 0x34);
      *(uint *)(local_a898 + 0x38) =
           (uint)bVar20 * auVar70._56_4_ | (uint)!bVar20 * *(int *)(local_a898 + 0x38);
      *(uint *)(local_a898 + 0x3c) =
           (uint)bVar21 * auVar70._60_4_ | (uint)!bVar21 * *(int *)(local_a898 + 0x3c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }